

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizer.h
# Opt level: O1

void Rasterizer::doRender<RasterizerA3<32u>>(RasterizerA3<32U> *self,uint32_t argb32)

{
  Cell *pCVar1;
  uint8_t *puVar2;
  Cell *pCVar3;
  uint uVar4;
  Image *pIVar5;
  long lVar6;
  long lVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  byte bVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  ulong uVar19;
  ulong uVar20;
  size_t sVar21;
  int iVar22;
  ulong uVar23;
  ulong uVar24;
  Cell *pCVar25;
  ulong uVar26;
  int iVar27;
  ulong uVar28;
  uint uVar29;
  BitWord BVar30;
  uint uVar31;
  uint8_t *puVar32;
  ulong uVar33;
  ulong uVar34;
  uint uVar35;
  BitWord *pBVar36;
  short sVar37;
  short sVar40;
  short sVar41;
  short sVar42;
  short sVar43;
  short sVar44;
  short sVar45;
  undefined1 in_XMM1 [16];
  undefined1 auVar38 [16];
  short sVar46;
  undefined1 auVar39 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar47 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar48 [16];
  short sVar49;
  short sVar51;
  short sVar52;
  undefined4 uVar53;
  short sVar69;
  short sVar71;
  short sVar72;
  short sVar74;
  short sVar76;
  undefined1 in_XMM6 [16];
  undefined1 auVar55 [16];
  short sVar67;
  undefined1 auVar57 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  short sVar68;
  short sVar70;
  short sVar78;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  short sVar73;
  short sVar75;
  short sVar77;
  short sVar79;
  undefined1 auVar66 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar80 [16];
  undefined1 in_XMM9 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  uint uVar87;
  undefined1 auVar88 [12];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar92 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  short sVar100;
  short sVar101;
  short sVar109;
  short sVar111;
  short sVar113;
  short sVar115;
  short sVar117;
  short sVar119;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  short sVar121;
  undefined1 auVar105 [16];
  short sVar110;
  short sVar112;
  short sVar114;
  short sVar116;
  short sVar118;
  short sVar120;
  short sVar122;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  short sVar123;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  int iVar135;
  int iVar137;
  undefined1 in_XMM13 [16];
  int iVar136;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  int iVar138;
  undefined1 auVar134 [16];
  undefined1 in_XMM14 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 in_XMM15 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  short sVar50;
  undefined1 auVar54 [12];
  undefined1 auVar58 [16];
  undefined1 auVar56 [16];
  undefined1 auVar59 [16];
  undefined1 auVar93 [16];
  undefined1 auVar91 [16];
  undefined1 auVar94 [16];
  ushort uVar98;
  ushort uVar99;
  
  auVar18 = _DAT_0011c1f0;
  auVar17 = _DAT_0011c1c0;
  uVar31 = (self->super_CellRasterizer).super_Rasterizer._options;
  bVar14 = (byte)(argb32 >> 8);
  if ((self->super_CellRasterizer).super_Rasterizer._fillMode != 1) {
    if ((uVar31 & 1) != 0) {
      uVar31 = (self->_yBounds).start;
      uVar34 = (ulong)(int)uVar31;
      uVar4 = (self->_yBounds).end;
      if (uVar31 <= uVar4) {
        pIVar5 = (self->super_CellRasterizer).super_Rasterizer._dst;
        lVar6 = pIVar5->_stride;
        iVar27 = (argb32 & 0xff00ff) * (argb32 >> 0x18);
        iVar22 = (bVar14 | 0xff0000) * (argb32 >> 0x18);
        uVar31 = (iVar27 + 0x800080U >> 8 & 0xff00ff) + iVar27 + 0x800080 >> 8 & 0xff00ff |
                 iVar22 + (iVar22 + 0x800080U >> 8 & 0xff00ff) + 0x800080 & 0xff00ff00;
        auVar38._4_4_ = uVar31;
        auVar38._0_4_ = uVar31;
        auVar38._8_4_ = uVar31;
        auVar38._12_4_ = uVar31;
        puVar32 = pIVar5->_data + lVar6 * uVar34;
        pCVar25 = self->_cells + self->_cellStride * uVar34;
        auVar39 = pmovzxbw(in_XMM1,auVar38);
        pBVar36 = self->_bits + self->_bitStride * uVar34;
        auVar47 = pmovzxbw(in_XMM2,0xffffffffffffffff);
        auVar48 = pmovzxbw(in_XMM3,0x8080808080808080);
        auVar55 = pmovsxwd(in_XMM8,0x1ff01ff01ff01ff);
        do {
          sVar21 = self->_bitStride;
          uVar29 = 0;
          uVar19 = 0;
          uVar33 = 0;
          do {
            BVar30 = *pBVar36;
            *pBVar36 = 0;
            sVar101 = auVar48._0_2_;
            sVar110 = auVar48._2_2_;
            sVar112 = auVar48._4_2_;
            sVar114 = auVar48._6_2_;
            sVar116 = auVar48._8_2_;
            sVar118 = auVar48._10_2_;
            sVar120 = auVar48._12_2_;
            sVar122 = auVar48._14_2_;
            sVar37 = auVar39._0_2_;
            sVar40 = auVar39._2_2_;
            sVar41 = auVar39._4_2_;
            sVar42 = auVar39._6_2_;
            sVar43 = auVar39._8_2_;
            sVar44 = auVar39._10_2_;
            sVar45 = auVar39._12_2_;
            sVar46 = auVar39._14_2_;
            if (BVar30 != 0) {
              do {
                lVar7 = 0;
                if (BVar30 != 0) {
                  for (; (BVar30 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
                  }
                }
                uVar26 = -1L << ((byte)lVar7 & 0x3f);
                uVar23 = (uint)((int)lVar7 << 5) | uVar33;
                uVar28 = uVar23 - uVar19;
                uVar24 = uVar19;
                if (uVar19 <= uVar23 && uVar28 != 0) {
                  uVar87 = uVar29 & 0x1ff;
                  uVar35 = uVar87 ^ 0x1ff;
                  if (uVar87 < 0x100) {
                    uVar35 = uVar87;
                  }
                  uVar24 = uVar23;
                  if (uVar35 != 0) {
                    uVar20 = uVar28 >> 2;
                    if (uVar35 == 0xff) {
                      if (0x1f < uVar28) {
                        do {
                          *(undefined1 (*) [16])(puVar32 + uVar19 * 4) = auVar38;
                          *(undefined1 (*) [16])(puVar32 + uVar19 * 4 + 0x10) = auVar38;
                          *(undefined1 (*) [16])(puVar32 + uVar19 * 4 + 0x20) = auVar38;
                          *(undefined1 (*) [16])(puVar32 + uVar19 * 4 + 0x30) = auVar38;
                          *(undefined1 (*) [16])(puVar32 + uVar19 * 4 + 0x40) = auVar38;
                          *(undefined1 (*) [16])(puVar32 + uVar19 * 4 + 0x50) = auVar38;
                          *(undefined1 (*) [16])(puVar32 + uVar19 * 4 + 0x60) = auVar38;
                          *(undefined1 (*) [16])(puVar32 + uVar19 * 4 + 0x70) = auVar38;
                          uVar19 = uVar19 + 0x20;
                          uVar20 = uVar20 - 8;
                        } while (7 < uVar20);
                      }
                      for (; uVar20 != 0; uVar20 = uVar20 - 1) {
                        *(undefined1 (*) [16])(puVar32 + uVar19 * 4) = auVar38;
                        uVar19 = uVar19 + 4;
                      }
                      for (; uVar19 < uVar23; uVar19 = uVar19 + 1) {
                        *(uint *)(puVar32 + uVar19 * 4) = uVar31;
                      }
                    }
                    else {
                      auVar80 = pshuflw(ZEXT416(uVar35),ZEXT416(uVar35),0);
                      auVar90._0_4_ = auVar80._0_4_;
                      auVar90._4_4_ = auVar90._0_4_;
                      auVar90._8_4_ = auVar90._0_4_;
                      auVar90._12_4_ = auVar90._0_4_;
                      sVar77 = auVar80._0_2_;
                      sVar79 = auVar80._2_2_;
                      auVar90 = auVar90 ^ auVar47;
                      in_XMM13._0_2_ = sVar77 * sVar37 + sVar101;
                      in_XMM13._2_2_ = sVar79 * sVar40 + sVar110;
                      in_XMM13._4_2_ = sVar77 * sVar41 + sVar112;
                      in_XMM13._6_2_ = sVar79 * sVar42 + sVar114;
                      in_XMM13._8_2_ = sVar77 * sVar43 + sVar116;
                      in_XMM13._10_2_ = sVar79 * sVar44 + sVar118;
                      in_XMM13._12_2_ = sVar77 * sVar45 + sVar120;
                      in_XMM13._14_2_ = sVar79 * sVar46 + sVar122;
                      sVar123 = auVar90._0_2_;
                      sVar50 = auVar90._2_2_;
                      sVar52 = auVar90._4_2_;
                      sVar49 = auVar90._6_2_;
                      sVar67 = auVar90._8_2_;
                      sVar69 = auVar90._10_2_;
                      sVar73 = auVar90._12_2_;
                      sVar75 = auVar90._14_2_;
                      if (7 < uVar28) {
                        do {
                          auVar80 = *(undefined1 (*) [16])(puVar32 + uVar19 * 4);
                          auVar90 = *(undefined1 (*) [16])(puVar32 + uVar19 * 4 + 0x10);
                          auVar147 = pmovzxbw(in_XMM15,auVar80);
                          auVar131 = pmovzxbw(in_XMM9,auVar90);
                          auVar102._0_2_ = (ushort)auVar80[8] * sVar123 + in_XMM13._0_2_;
                          auVar102._2_2_ = (ushort)auVar80[9] * sVar50 + in_XMM13._2_2_;
                          auVar102._4_2_ = (ushort)auVar80[10] * sVar52 + in_XMM13._4_2_;
                          auVar102._6_2_ = (ushort)auVar80[0xb] * sVar49 + in_XMM13._6_2_;
                          auVar102._8_2_ = (ushort)auVar80[0xc] * sVar67 + in_XMM13._8_2_;
                          auVar102._10_2_ = (ushort)auVar80[0xd] * sVar69 + in_XMM13._10_2_;
                          auVar102._12_2_ = (ushort)auVar80[0xe] * sVar73 + in_XMM13._12_2_;
                          auVar102._14_2_ = (ushort)auVar80[0xf] * sVar75 + in_XMM13._14_2_;
                          in_XMM6 = pmulhuw(auVar102,auVar17);
                          auVar142._0_2_ = (ushort)auVar90[8] * sVar123 + in_XMM13._0_2_;
                          auVar142._2_2_ = (ushort)auVar90[9] * sVar50 + in_XMM13._2_2_;
                          auVar142._4_2_ = (ushort)auVar90[10] * sVar52 + in_XMM13._4_2_;
                          auVar142._6_2_ = (ushort)auVar90[0xb] * sVar49 + in_XMM13._6_2_;
                          auVar142._8_2_ = (ushort)auVar90[0xc] * sVar67 + in_XMM13._8_2_;
                          auVar142._10_2_ = (ushort)auVar90[0xd] * sVar69 + in_XMM13._10_2_;
                          auVar142._12_2_ = (ushort)auVar90[0xe] * sVar73 + in_XMM13._12_2_;
                          auVar142._14_2_ = (ushort)auVar90[0xf] * sVar75 + in_XMM13._14_2_;
                          in_XMM14 = pmulhuw(auVar142,auVar17);
                          auVar150._0_2_ = auVar147._0_2_ * sVar123 + in_XMM13._0_2_;
                          auVar150._2_2_ = auVar147._2_2_ * sVar50 + in_XMM13._2_2_;
                          auVar150._4_2_ = auVar147._4_2_ * sVar52 + in_XMM13._4_2_;
                          auVar150._6_2_ = auVar147._6_2_ * sVar49 + in_XMM13._6_2_;
                          auVar150._8_2_ = auVar147._8_2_ * sVar67 + in_XMM13._8_2_;
                          auVar150._10_2_ = auVar147._10_2_ * sVar69 + in_XMM13._10_2_;
                          auVar150._12_2_ = auVar147._12_2_ * sVar73 + in_XMM13._12_2_;
                          auVar150._14_2_ = auVar147._14_2_ * sVar75 + in_XMM13._14_2_;
                          auVar80 = pmulhuw(auVar150,auVar17);
                          sVar51 = auVar80._0_2_;
                          sVar68 = auVar80._2_2_;
                          in_XMM15[1] = (0 < sVar68) * (sVar68 < 0x100) * auVar80[2] -
                                        (0xff < sVar68);
                          in_XMM15[0] = (0 < sVar51) * (sVar51 < 0x100) * auVar80[0] -
                                        (0xff < sVar51);
                          sVar51 = auVar80._4_2_;
                          in_XMM15[2] = (0 < sVar51) * (sVar51 < 0x100) * auVar80[4] -
                                        (0xff < sVar51);
                          sVar51 = auVar80._6_2_;
                          in_XMM15[3] = (0 < sVar51) * (sVar51 < 0x100) * auVar80[6] -
                                        (0xff < sVar51);
                          sVar51 = auVar80._8_2_;
                          in_XMM15[4] = (0 < sVar51) * (sVar51 < 0x100) * auVar80[8] -
                                        (0xff < sVar51);
                          sVar51 = auVar80._10_2_;
                          in_XMM15[5] = (0 < sVar51) * (sVar51 < 0x100) * auVar80[10] -
                                        (0xff < sVar51);
                          sVar51 = auVar80._12_2_;
                          in_XMM15[6] = (0 < sVar51) * (sVar51 < 0x100) * auVar80[0xc] -
                                        (0xff < sVar51);
                          sVar51 = auVar80._14_2_;
                          in_XMM15[7] = (0 < sVar51) * (sVar51 < 0x100) * auVar80[0xe] -
                                        (0xff < sVar51);
                          sVar51 = in_XMM6._0_2_;
                          in_XMM15[8] = (0 < sVar51) * (sVar51 < 0x100) * in_XMM6[0] -
                                        (0xff < sVar51);
                          sVar51 = in_XMM6._2_2_;
                          in_XMM15[9] = (0 < sVar51) * (sVar51 < 0x100) * in_XMM6[2] -
                                        (0xff < sVar51);
                          sVar51 = in_XMM6._4_2_;
                          in_XMM15[10] = (0 < sVar51) * (sVar51 < 0x100) * in_XMM6[4] -
                                         (0xff < sVar51);
                          sVar51 = in_XMM6._6_2_;
                          in_XMM15[0xb] =
                               (0 < sVar51) * (sVar51 < 0x100) * in_XMM6[6] - (0xff < sVar51);
                          sVar51 = in_XMM6._8_2_;
                          in_XMM15[0xc] =
                               (0 < sVar51) * (sVar51 < 0x100) * in_XMM6[8] - (0xff < sVar51);
                          sVar51 = in_XMM6._10_2_;
                          in_XMM15[0xd] =
                               (0 < sVar51) * (sVar51 < 0x100) * in_XMM6[10] - (0xff < sVar51);
                          sVar51 = in_XMM6._12_2_;
                          in_XMM15[0xe] =
                               (0 < sVar51) * (sVar51 < 0x100) * in_XMM6[0xc] - (0xff < sVar51);
                          sVar51 = in_XMM6._14_2_;
                          in_XMM15[0xf] =
                               (0 < sVar51) * (sVar51 < 0x100) * in_XMM6[0xe] - (0xff < sVar51);
                          auVar80._0_2_ = auVar131._0_2_ * sVar123 + in_XMM13._0_2_;
                          auVar80._2_2_ = auVar131._2_2_ * sVar50 + in_XMM13._2_2_;
                          auVar80._4_2_ = auVar131._4_2_ * sVar52 + in_XMM13._4_2_;
                          auVar80._6_2_ = auVar131._6_2_ * sVar49 + in_XMM13._6_2_;
                          auVar80._8_2_ = auVar131._8_2_ * sVar67 + in_XMM13._8_2_;
                          auVar80._10_2_ = auVar131._10_2_ * sVar69 + in_XMM13._10_2_;
                          auVar80._12_2_ = auVar131._12_2_ * sVar73 + in_XMM13._12_2_;
                          auVar80._14_2_ = auVar131._14_2_ * sVar75 + in_XMM13._14_2_;
                          auVar80 = pmulhuw(auVar80,auVar17);
                          sVar51 = auVar80._0_2_;
                          sVar68 = auVar80._2_2_;
                          in_XMM9[1] = (0 < sVar68) * (sVar68 < 0x100) * auVar80[2] -
                                       (0xff < sVar68);
                          in_XMM9[0] = (0 < sVar51) * (sVar51 < 0x100) * auVar80[0] -
                                       (0xff < sVar51);
                          sVar51 = auVar80._4_2_;
                          in_XMM9[2] = (0 < sVar51) * (sVar51 < 0x100) * auVar80[4] -
                                       (0xff < sVar51);
                          sVar51 = auVar80._6_2_;
                          in_XMM9[3] = (0 < sVar51) * (sVar51 < 0x100) * auVar80[6] -
                                       (0xff < sVar51);
                          sVar51 = auVar80._8_2_;
                          in_XMM9[4] = (0 < sVar51) * (sVar51 < 0x100) * auVar80[8] -
                                       (0xff < sVar51);
                          sVar51 = auVar80._10_2_;
                          in_XMM9[5] = (0 < sVar51) * (sVar51 < 0x100) * auVar80[10] -
                                       (0xff < sVar51);
                          sVar51 = auVar80._12_2_;
                          in_XMM9[6] = (0 < sVar51) * (sVar51 < 0x100) * auVar80[0xc] -
                                       (0xff < sVar51);
                          sVar51 = auVar80._14_2_;
                          in_XMM9[7] = (0 < sVar51) * (sVar51 < 0x100) * auVar80[0xe] -
                                       (0xff < sVar51);
                          sVar51 = in_XMM14._0_2_;
                          in_XMM9[8] = (0 < sVar51) * (sVar51 < 0x100) * in_XMM14[0] -
                                       (0xff < sVar51);
                          sVar51 = in_XMM14._2_2_;
                          in_XMM9[9] = (0 < sVar51) * (sVar51 < 0x100) * in_XMM14[2] -
                                       (0xff < sVar51);
                          sVar51 = in_XMM14._4_2_;
                          in_XMM9[10] = (0 < sVar51) * (sVar51 < 0x100) * in_XMM14[4] -
                                        (0xff < sVar51);
                          sVar51 = in_XMM14._6_2_;
                          in_XMM9[0xb] = (0 < sVar51) * (sVar51 < 0x100) * in_XMM14[6] -
                                         (0xff < sVar51);
                          sVar51 = in_XMM14._8_2_;
                          in_XMM9[0xc] = (0 < sVar51) * (sVar51 < 0x100) * in_XMM14[8] -
                                         (0xff < sVar51);
                          sVar51 = in_XMM14._10_2_;
                          in_XMM9[0xd] = (0 < sVar51) * (sVar51 < 0x100) * in_XMM14[10] -
                                         (0xff < sVar51);
                          sVar51 = in_XMM14._12_2_;
                          in_XMM9[0xe] = (0 < sVar51) * (sVar51 < 0x100) * in_XMM14[0xc] -
                                         (0xff < sVar51);
                          sVar51 = in_XMM14._14_2_;
                          in_XMM9[0xf] = (0 < sVar51) * (sVar51 < 0x100) * in_XMM14[0xe] -
                                         (0xff < sVar51);
                          *(undefined1 (*) [16])(puVar32 + uVar19 * 4) = in_XMM15;
                          *(undefined1 (*) [16])(puVar32 + uVar19 * 4 + 0x10) = in_XMM9;
                          uVar19 = uVar19 + 8;
                          uVar20 = uVar20 - 2;
                        } while (1 < uVar20);
                      }
                      if (uVar20 != 0) {
                        auVar80 = *(undefined1 (*) [16])(puVar32 + uVar19 * 4);
                        auVar90 = pmovzxbw(in_XMM9,auVar80);
                        auVar131._0_2_ = (ushort)auVar80[8] * sVar123 + in_XMM13._0_2_;
                        auVar131._2_2_ = (ushort)auVar80[9] * sVar50 + in_XMM13._2_2_;
                        auVar131._4_2_ = (ushort)auVar80[10] * sVar52 + in_XMM13._4_2_;
                        auVar131._6_2_ = (ushort)auVar80[0xb] * sVar49 + in_XMM13._6_2_;
                        auVar131._8_2_ = (ushort)auVar80[0xc] * sVar67 + in_XMM13._8_2_;
                        auVar131._10_2_ = (ushort)auVar80[0xd] * sVar69 + in_XMM13._10_2_;
                        auVar131._12_2_ = (ushort)auVar80[0xe] * sVar73 + in_XMM13._12_2_;
                        auVar131._14_2_ = (ushort)auVar80[0xf] * sVar75 + in_XMM13._14_2_;
                        in_XMM6 = pmulhuw(auVar131,auVar17);
                        auVar147._0_2_ = auVar90._0_2_ * sVar123 + in_XMM13._0_2_;
                        auVar147._2_2_ = auVar90._2_2_ * sVar50 + in_XMM13._2_2_;
                        auVar147._4_2_ = auVar90._4_2_ * sVar52 + in_XMM13._4_2_;
                        auVar147._6_2_ = auVar90._6_2_ * sVar49 + in_XMM13._6_2_;
                        auVar147._8_2_ = auVar90._8_2_ * sVar67 + in_XMM13._8_2_;
                        auVar147._10_2_ = auVar90._10_2_ * sVar69 + in_XMM13._10_2_;
                        auVar147._12_2_ = auVar90._12_2_ * sVar73 + in_XMM13._12_2_;
                        auVar147._14_2_ = auVar90._14_2_ * sVar75 + in_XMM13._14_2_;
                        auVar80 = pmulhuw(auVar147,auVar17);
                        sVar51 = auVar80._0_2_;
                        sVar68 = auVar80._2_2_;
                        in_XMM9[1] = (0 < sVar68) * (sVar68 < 0x100) * auVar80[2] - (0xff < sVar68);
                        in_XMM9[0] = (0 < sVar51) * (sVar51 < 0x100) * auVar80[0] - (0xff < sVar51);
                        sVar51 = auVar80._4_2_;
                        in_XMM9[2] = (0 < sVar51) * (sVar51 < 0x100) * auVar80[4] - (0xff < sVar51);
                        sVar51 = auVar80._6_2_;
                        in_XMM9[3] = (0 < sVar51) * (sVar51 < 0x100) * auVar80[6] - (0xff < sVar51);
                        sVar51 = auVar80._8_2_;
                        in_XMM9[4] = (0 < sVar51) * (sVar51 < 0x100) * auVar80[8] - (0xff < sVar51);
                        sVar51 = auVar80._10_2_;
                        in_XMM9[5] = (0 < sVar51) * (sVar51 < 0x100) * auVar80[10] - (0xff < sVar51)
                        ;
                        sVar51 = auVar80._12_2_;
                        in_XMM9[6] = (0 < sVar51) * (sVar51 < 0x100) * auVar80[0xc] -
                                     (0xff < sVar51);
                        sVar51 = auVar80._14_2_;
                        in_XMM9[7] = (0 < sVar51) * (sVar51 < 0x100) * auVar80[0xe] -
                                     (0xff < sVar51);
                        sVar51 = in_XMM6._0_2_;
                        in_XMM9[8] = (0 < sVar51) * (sVar51 < 0x100) * in_XMM6[0] - (0xff < sVar51);
                        sVar51 = in_XMM6._2_2_;
                        in_XMM9[9] = (0 < sVar51) * (sVar51 < 0x100) * in_XMM6[2] - (0xff < sVar51);
                        sVar51 = in_XMM6._4_2_;
                        in_XMM9[10] = (0 < sVar51) * (sVar51 < 0x100) * in_XMM6[4] - (0xff < sVar51)
                        ;
                        sVar51 = in_XMM6._6_2_;
                        in_XMM9[0xb] = (0 < sVar51) * (sVar51 < 0x100) * in_XMM6[6] -
                                       (0xff < sVar51);
                        sVar51 = in_XMM6._8_2_;
                        in_XMM9[0xc] = (0 < sVar51) * (sVar51 < 0x100) * in_XMM6[8] -
                                       (0xff < sVar51);
                        sVar51 = in_XMM6._10_2_;
                        in_XMM9[0xd] = (0 < sVar51) * (sVar51 < 0x100) * in_XMM6[10] -
                                       (0xff < sVar51);
                        sVar51 = in_XMM6._12_2_;
                        in_XMM9[0xe] = (0 < sVar51) * (sVar51 < 0x100) * in_XMM6[0xc] -
                                       (0xff < sVar51);
                        sVar51 = in_XMM6._14_2_;
                        in_XMM9[0xf] = (0 < sVar51) * (sVar51 < 0x100) * in_XMM6[0xe] -
                                       (0xff < sVar51);
                        *(undefined1 (*) [16])(puVar32 + uVar19 * 4) = in_XMM9;
                        uVar19 = uVar19 + 4;
                      }
                      in_XMM6 = pmovzxbw(in_XMM6,0x8080808080808080);
                      if (uVar19 < uVar23) {
                        sVar51 = in_XMM6._0_2_;
                        sVar68 = in_XMM6._2_2_;
                        sVar70 = in_XMM6._4_2_;
                        sVar71 = in_XMM6._6_2_;
                        sVar72 = in_XMM6._8_2_;
                        sVar74 = in_XMM6._10_2_;
                        sVar76 = in_XMM6._12_2_;
                        sVar78 = in_XMM6._14_2_;
                        do {
                          auVar80 = pmovzxbw(ZEXT416(*(uint *)(puVar32 + uVar19 * 4)),
                                             ZEXT416(*(uint *)(puVar32 + uVar19 * 4)));
                          auVar63._0_2_ = auVar80._0_2_ * sVar123 + sVar77 * sVar37 + sVar51;
                          auVar63._2_2_ = auVar80._2_2_ * sVar50 + sVar79 * sVar40 + sVar68;
                          auVar63._4_2_ = auVar80._4_2_ * sVar52 + sVar77 * sVar41 + sVar70;
                          auVar63._6_2_ = auVar80._6_2_ * sVar49 + sVar79 * sVar42 + sVar71;
                          auVar63._8_2_ = auVar80._8_2_ * sVar67 + sVar77 * sVar43 + sVar72;
                          auVar63._10_2_ = auVar80._10_2_ * sVar69 + sVar79 * sVar44 + sVar74;
                          auVar63._12_2_ = auVar80._12_2_ * sVar73 + sVar77 * sVar45 + sVar76;
                          auVar63._14_2_ = auVar80._14_2_ * sVar75 + sVar79 * sVar46 + sVar78;
                          auVar80 = pmulhuw(auVar63,auVar18);
                          sVar100 = auVar80._0_2_;
                          sVar109 = auVar80._2_2_;
                          sVar111 = auVar80._4_2_;
                          sVar113 = auVar80._6_2_;
                          in_XMM6._0_4_ =
                               CONCAT13((0 < sVar113) * (sVar113 < 0x100) * auVar80[6] -
                                        (0xff < sVar113),
                                        CONCAT12((0 < sVar111) * (sVar111 < 0x100) * auVar80[4] -
                                                 (0xff < sVar111),
                                                 CONCAT11((0 < sVar109) * (sVar109 < 0x100) *
                                                          auVar80[2] - (0xff < sVar109),
                                                          (0 < sVar100) * (sVar100 < 0x100) *
                                                          auVar80[0] - (0xff < sVar100))));
                          sVar115 = auVar80._8_2_;
                          in_XMM6[4] = (0 < sVar115) * (sVar115 < 0x100) * auVar80[8] -
                                       (0xff < sVar115);
                          sVar117 = auVar80._10_2_;
                          in_XMM6[5] = (0 < sVar117) * (sVar117 < 0x100) * auVar80[10] -
                                       (0xff < sVar117);
                          sVar119 = auVar80._12_2_;
                          in_XMM6[6] = (0 < sVar119) * (sVar119 < 0x100) * auVar80[0xc] -
                                       (0xff < sVar119);
                          sVar121 = auVar80._14_2_;
                          in_XMM6[7] = (0 < sVar121) * (sVar121 < 0x100) * auVar80[0xe] -
                                       (0xff < sVar121);
                          in_XMM6[8] = (0 < sVar100) * (sVar100 < 0x100) * auVar80[0] -
                                       (0xff < sVar100);
                          in_XMM6[9] = (0 < sVar109) * (sVar109 < 0x100) * auVar80[2] -
                                       (0xff < sVar109);
                          in_XMM6[10] = (0 < sVar111) * (sVar111 < 0x100) * auVar80[4] -
                                        (0xff < sVar111);
                          in_XMM6[0xb] = (0 < sVar113) * (sVar113 < 0x100) * auVar80[6] -
                                         (0xff < sVar113);
                          in_XMM6[0xc] = (0 < sVar115) * (sVar115 < 0x100) * auVar80[8] -
                                         (0xff < sVar115);
                          in_XMM6[0xd] = (0 < sVar117) * (sVar117 < 0x100) * auVar80[10] -
                                         (0xff < sVar117);
                          in_XMM6[0xe] = (0 < sVar119) * (sVar119 < 0x100) * auVar80[0xc] -
                                         (0xff < sVar119);
                          in_XMM6[0xf] = (0 < sVar121) * (sVar121 < 0x100) * auVar80[0xe] -
                                         (0xff < sVar121);
                          *(undefined4 *)(puVar32 + uVar19 * 4) = in_XMM6._0_4_;
                          uVar19 = uVar19 + 1;
                        } while (uVar19 < uVar23);
                      }
                    }
                  }
                }
                uVar23 = uVar26 ^ BVar30;
                if (BVar30 == uVar26) {
                  uVar19 = (ulong)(self->super_CellRasterizer).super_Rasterizer._width;
                  if (uVar33 + 0x800 < uVar19) {
                    uVar19 = uVar33 + 0x800;
                  }
                }
                else {
                  lVar7 = 0;
                  if (uVar23 != 0) {
                    for (; (uVar23 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
                    }
                  }
                  uVar23 = -1L << ((byte)lVar7 & 0x3f) ^ uVar23;
                  uVar19 = (uint)((int)lVar7 << 5) | uVar33;
                }
                auVar107 = ZEXT416(uVar29);
                if (3 < uVar19 - uVar24) {
                  auVar107._4_4_ = uVar29;
                  auVar107._0_4_ = uVar29;
                  auVar107._8_4_ = uVar29;
                  auVar107._12_4_ = uVar29;
                  uVar26 = uVar19 - uVar24 >> 2;
                  do {
                    pCVar1 = pCVar25 + uVar24;
                    iVar22 = pCVar1->cover;
                    pCVar3 = pCVar25 + uVar24 + 2;
                    iVar137 = iVar22 + pCVar1[1].cover;
                    auVar16._4_4_ = iVar137;
                    auVar16._0_4_ = iVar22;
                    auVar16._8_8_ = 0;
                    iVar27 = auVar107._0_4_;
                    iVar135 = auVar107._4_4_;
                    iVar136 = auVar107._8_4_;
                    iVar138 = pCVar3->cover + pCVar3[1].cover + auVar107._12_4_ + iVar137;
                    auVar107._4_4_ = iVar138;
                    auVar107._0_4_ = iVar138;
                    auVar107._8_4_ = iVar138;
                    auVar107._12_4_ = iVar138;
                    auVar134._0_4_ = (iVar22 + iVar27) - ((uint)pCVar1->area >> 9);
                    auVar134._4_4_ = (iVar137 + iVar135) - ((uint)pCVar1[1].area >> 9);
                    auVar134._8_4_ =
                         (pCVar1[1].cover + pCVar3->cover + iVar136 + iVar22) -
                         ((uint)pCVar3->area >> 9);
                    auVar134._12_4_ = iVar138 - ((uint)pCVar3[1].area >> 9);
                    auVar102 = packusdw(auVar134 & auVar55,auVar134 & auVar55);
                    iVar22 = 0x1ff01ff - auVar102._0_4_;
                    iVar27 = 0x1ff01ff - auVar102._4_4_;
                    iVar135 = 0x1ff01ff - auVar102._8_4_;
                    iVar136 = 0x1ff01ff - auVar102._12_4_;
                    sVar123 = auVar102._0_2_;
                    sVar49 = (short)iVar22;
                    sVar50 = auVar102._2_2_;
                    sVar67 = (short)((uint)iVar22 >> 0x10);
                    sVar52 = auVar102._4_2_;
                    sVar69 = (short)iVar27;
                    uVar98 = (ushort)(sVar52 < sVar69) * sVar52 |
                             (ushort)(sVar52 >= sVar69) * sVar69;
                    sVar52 = auVar102._6_2_;
                    sVar69 = (short)((uint)iVar27 >> 0x10);
                    uVar99 = (ushort)(sVar52 < sVar69) * sVar52 |
                             (ushort)(sVar52 >= sVar69) * sVar69;
                    auVar57._0_8_ =
                         CONCAT26(uVar99,CONCAT24(uVar98,CONCAT22((ushort)(sVar50 < sVar67) * sVar50
                                                                  | (ushort)(sVar50 >= sVar67) *
                                                                    sVar67,(ushort)(sVar123 < sVar49
                                                                                   ) * sVar123 |
                                                                           (ushort)(sVar123 >=
                                                                                   sVar49) * sVar49)
                                                 ));
                    sVar123 = auVar102._8_2_;
                    sVar50 = (short)iVar135;
                    auVar54._0_10_ =
                         CONCAT28((ushort)(sVar123 < sVar50) * sVar123 |
                                  (ushort)(sVar123 >= sVar50) * sVar50,auVar57._0_8_);
                    sVar123 = auVar102._10_2_;
                    sVar50 = (short)((uint)iVar135 >> 0x10);
                    auVar54._10_2_ =
                         (ushort)(sVar123 < sVar50) * sVar123 | (ushort)(sVar123 >= sVar50) * sVar50
                    ;
                    sVar123 = auVar102._12_2_;
                    sVar50 = (short)iVar136;
                    sVar52 = (short)((uint)iVar136 >> 0x10);
                    auVar56._12_2_ =
                         (ushort)(sVar123 < sVar50) * sVar123 | (ushort)(sVar123 >= sVar50) * sVar50
                    ;
                    auVar56._0_12_ = auVar54;
                    sVar123 = auVar102._14_2_;
                    auVar56._14_2_ =
                         (ushort)(sVar123 < sVar52) * sVar123 | (ushort)(sVar123 >= sVar52) * sVar52
                    ;
                    auVar90 = pshuflw(auVar16 << 0x40,auVar56,0x50);
                    auVar59._12_2_ = uVar99;
                    auVar59._0_12_ = auVar54;
                    auVar59._14_2_ = uVar99;
                    auVar58._12_4_ = auVar59._12_4_;
                    auVar58._10_2_ = uVar98;
                    auVar58._0_10_ = auVar54._0_10_;
                    auVar57._10_6_ = auVar58._10_6_;
                    auVar57._8_2_ = uVar98;
                    *(undefined1 (*) [16])(pCVar25 + uVar24) = (undefined1  [16])0x0;
                    *(undefined1 (*) [16])(pCVar25 + uVar24 + 2) = (undefined1  [16])0x0;
                    auVar80 = *(undefined1 (*) [16])(puVar32 + uVar24 * 4);
                    in_XMM13 = pmovzxbw(auVar102,auVar80);
                    auVar83._0_4_ = auVar90._0_4_;
                    auVar83._4_4_ = auVar83._0_4_;
                    auVar83._8_4_ = auVar90._4_4_;
                    auVar83._12_4_ = auVar90._4_4_;
                    auVar60._4_4_ = auVar57._8_4_;
                    auVar60._0_4_ = auVar57._8_4_;
                    auVar60._8_4_ = auVar58._12_4_;
                    auVar60._12_4_ = auVar58._12_4_;
                    auVar83 = auVar83 ^ auVar47;
                    in_XMM9._0_2_ = auVar83._0_2_ * in_XMM13._0_2_;
                    in_XMM9._2_2_ = auVar83._2_2_ * in_XMM13._2_2_;
                    in_XMM9._4_2_ = auVar83._4_2_ * in_XMM13._4_2_;
                    in_XMM9._6_2_ = auVar83._6_2_ * in_XMM13._6_2_;
                    in_XMM9._8_2_ = auVar83._8_2_ * in_XMM13._8_2_;
                    in_XMM9._10_2_ = auVar83._10_2_ * in_XMM13._10_2_;
                    in_XMM9._12_2_ = auVar83._12_2_ * in_XMM13._12_2_;
                    in_XMM9._14_2_ = auVar83._14_2_ * in_XMM13._14_2_;
                    auVar60 = auVar60 ^ auVar47;
                    in_XMM6._0_2_ = auVar60._0_2_ * (ushort)auVar80[8];
                    in_XMM6._2_2_ = auVar60._2_2_ * (ushort)auVar80[9];
                    in_XMM6._4_2_ = auVar60._4_2_ * (ushort)auVar80[10];
                    in_XMM6._6_2_ = auVar60._6_2_ * (ushort)auVar80[0xb];
                    in_XMM6._8_2_ = auVar60._8_2_ * (ushort)auVar80[0xc];
                    in_XMM6._10_2_ = auVar60._10_2_ * (ushort)auVar80[0xd];
                    in_XMM6._12_2_ = auVar60._12_2_ * (ushort)auVar80[0xe];
                    in_XMM6._14_2_ = auVar60._14_2_ * (ushort)auVar80[0xf];
                    auVar143._0_2_ = auVar90._0_2_ * sVar37 + sVar101 + in_XMM9._0_2_;
                    auVar143._2_2_ = auVar90._2_2_ * sVar40 + sVar110 + in_XMM9._2_2_;
                    auVar143._4_2_ = auVar90._0_2_ * sVar41 + sVar112 + in_XMM9._4_2_;
                    auVar143._6_2_ = auVar90._2_2_ * sVar42 + sVar114 + in_XMM9._6_2_;
                    auVar143._8_2_ = auVar90._4_2_ * sVar43 + sVar116 + in_XMM9._8_2_;
                    auVar143._10_2_ = auVar90._6_2_ * sVar44 + sVar118 + in_XMM9._10_2_;
                    auVar143._12_2_ = auVar90._4_2_ * sVar45 + sVar120 + in_XMM9._12_2_;
                    auVar143._14_2_ = auVar90._6_2_ * sVar46 + sVar122 + in_XMM9._14_2_;
                    auVar80 = pmulhuw(auVar143,auVar17);
                    auVar149._0_2_ = uVar98 * sVar37 + sVar101 + in_XMM6._0_2_;
                    auVar149._2_2_ = uVar98 * sVar40 + sVar110 + in_XMM6._2_2_;
                    auVar149._4_2_ = uVar98 * sVar41 + sVar112 + in_XMM6._4_2_;
                    auVar149._6_2_ = uVar98 * sVar42 + sVar114 + in_XMM6._6_2_;
                    auVar149._8_2_ = uVar99 * sVar43 + sVar116 + in_XMM6._8_2_;
                    auVar149._10_2_ = uVar99 * sVar44 + sVar118 + in_XMM6._10_2_;
                    auVar149._12_2_ = uVar99 * sVar45 + sVar120 + in_XMM6._12_2_;
                    auVar149._14_2_ = uVar99 * sVar46 + sVar122 + in_XMM6._14_2_;
                    in_XMM15 = pmulhuw(auVar149,auVar17);
                    sVar123 = auVar80._0_2_;
                    sVar50 = auVar80._2_2_;
                    in_XMM14[1] = (0 < sVar50) * (sVar50 < 0x100) * auVar80[2] - (0xff < sVar50);
                    in_XMM14[0] = (0 < sVar123) * (sVar123 < 0x100) * auVar80[0] - (0xff < sVar123);
                    sVar123 = auVar80._4_2_;
                    in_XMM14[2] = (0 < sVar123) * (sVar123 < 0x100) * auVar80[4] - (0xff < sVar123);
                    sVar123 = auVar80._6_2_;
                    in_XMM14[3] = (0 < sVar123) * (sVar123 < 0x100) * auVar80[6] - (0xff < sVar123);
                    sVar123 = auVar80._8_2_;
                    in_XMM14[4] = (0 < sVar123) * (sVar123 < 0x100) * auVar80[8] - (0xff < sVar123);
                    sVar123 = auVar80._10_2_;
                    in_XMM14[5] = (0 < sVar123) * (sVar123 < 0x100) * auVar80[10] - (0xff < sVar123)
                    ;
                    sVar123 = auVar80._12_2_;
                    in_XMM14[6] = (0 < sVar123) * (sVar123 < 0x100) * auVar80[0xc] -
                                  (0xff < sVar123);
                    sVar123 = auVar80._14_2_;
                    in_XMM14[7] = (0 < sVar123) * (sVar123 < 0x100) * auVar80[0xe] -
                                  (0xff < sVar123);
                    sVar123 = in_XMM15._0_2_;
                    in_XMM14[8] = (0 < sVar123) * (sVar123 < 0x100) * in_XMM15[0] - (0xff < sVar123)
                    ;
                    sVar123 = in_XMM15._2_2_;
                    in_XMM14[9] = (0 < sVar123) * (sVar123 < 0x100) * in_XMM15[2] - (0xff < sVar123)
                    ;
                    sVar123 = in_XMM15._4_2_;
                    in_XMM14[10] = (0 < sVar123) * (sVar123 < 0x100) * in_XMM15[4] -
                                   (0xff < sVar123);
                    sVar123 = in_XMM15._6_2_;
                    in_XMM14[0xb] =
                         (0 < sVar123) * (sVar123 < 0x100) * in_XMM15[6] - (0xff < sVar123);
                    sVar123 = in_XMM15._8_2_;
                    in_XMM14[0xc] =
                         (0 < sVar123) * (sVar123 < 0x100) * in_XMM15[8] - (0xff < sVar123);
                    sVar123 = in_XMM15._10_2_;
                    in_XMM14[0xd] =
                         (0 < sVar123) * (sVar123 < 0x100) * in_XMM15[10] - (0xff < sVar123);
                    sVar123 = in_XMM15._12_2_;
                    in_XMM14[0xe] =
                         (0 < sVar123) * (sVar123 < 0x100) * in_XMM15[0xc] - (0xff < sVar123);
                    sVar123 = in_XMM15._14_2_;
                    in_XMM14[0xf] =
                         (0 < sVar123) * (sVar123 < 0x100) * in_XMM15[0xe] - (0xff < sVar123);
                    *(undefined1 (*) [16])(puVar32 + uVar24 * 4) = in_XMM14;
                    uVar24 = uVar24 + 4;
                    uVar26 = uVar26 - 1;
                  } while (uVar26 != 0);
                }
                if (uVar24 < uVar19) {
                  in_XMM13 = pmovzxbw(in_XMM13,0x8080808080808080);
                  in_XMM14 = pmovzxbw(in_XMM14,0xffffffffffffffff);
                  auVar80 = auVar107;
                  do {
                    auVar107._0_4_ = auVar80._0_4_ + pCVar25[uVar24].cover;
                    auVar107._4_4_ = auVar80._4_4_;
                    auVar107._8_4_ = auVar80._8_4_;
                    auVar107._12_4_ = auVar80._12_4_;
                    uVar29 = pCVar25[uVar24].area;
                    pCVar25[uVar24].cover = 0;
                    pCVar25[uVar24].area = 0;
                    auVar84._0_4_ = auVar107._0_4_ - (uVar29 >> 9);
                    auVar84._4_4_ = auVar107._4_4_;
                    auVar84._8_4_ = auVar107._8_4_;
                    auVar84._12_4_ = auVar107._12_4_;
                    auVar80 = packusdw(auVar84 & auVar55,auVar84 & auVar55);
                    iVar22 = auVar55._0_4_ - auVar80._0_4_;
                    iVar27 = auVar55._4_4_ - auVar80._4_4_;
                    iVar135 = auVar55._8_4_ - auVar80._8_4_;
                    iVar136 = auVar55._12_4_ - auVar80._12_4_;
                    sVar123 = auVar80._0_2_;
                    sVar50 = (short)iVar22;
                    auVar61._0_2_ =
                         (ushort)(sVar123 < sVar50) * sVar123 | (ushort)(sVar123 >= sVar50) * sVar50
                    ;
                    sVar123 = auVar80._2_2_;
                    sVar50 = (short)((uint)iVar22 >> 0x10);
                    auVar61._2_2_ =
                         (ushort)(sVar123 < sVar50) * sVar123 | (ushort)(sVar123 >= sVar50) * sVar50
                    ;
                    sVar123 = auVar80._4_2_;
                    sVar50 = (short)iVar27;
                    auVar61._4_2_ =
                         (ushort)(sVar123 < sVar50) * sVar123 | (ushort)(sVar123 >= sVar50) * sVar50
                    ;
                    sVar123 = auVar80._6_2_;
                    sVar50 = (short)((uint)iVar27 >> 0x10);
                    auVar61._6_2_ =
                         (ushort)(sVar123 < sVar50) * sVar123 | (ushort)(sVar123 >= sVar50) * sVar50
                    ;
                    sVar123 = auVar80._8_2_;
                    sVar50 = (short)iVar135;
                    auVar61._8_2_ =
                         (ushort)(sVar123 < sVar50) * sVar123 | (ushort)(sVar123 >= sVar50) * sVar50
                    ;
                    sVar123 = auVar80._10_2_;
                    sVar50 = (short)((uint)iVar135 >> 0x10);
                    auVar61._10_2_ =
                         (ushort)(sVar123 < sVar50) * sVar123 | (ushort)(sVar123 >= sVar50) * sVar50
                    ;
                    sVar123 = auVar80._12_2_;
                    sVar50 = (short)iVar136;
                    sVar52 = (short)((uint)iVar136 >> 0x10);
                    auVar61._12_2_ =
                         (ushort)(sVar123 < sVar50) * sVar123 | (ushort)(sVar123 >= sVar50) * sVar50
                    ;
                    sVar123 = auVar80._14_2_;
                    auVar61._14_2_ =
                         (ushort)(sVar123 < sVar52) * sVar123 | (ushort)(sVar123 >= sVar52) * sVar52
                    ;
                    auVar80 = pshuflw(auVar61,auVar61,0);
                    in_XMM9 = pmovzxbw(ZEXT416(*(uint *)(puVar32 + uVar24 * 4)),
                                       ZEXT416(*(uint *)(puVar32 + uVar24 * 4)));
                    auVar90 = auVar80 ^ in_XMM14;
                    auVar62._0_2_ =
                         auVar90._0_2_ * in_XMM9._0_2_ + auVar80._0_2_ * sVar37 + in_XMM13._0_2_;
                    auVar62._2_2_ =
                         auVar90._2_2_ * in_XMM9._2_2_ + auVar80._2_2_ * sVar40 + in_XMM13._2_2_;
                    auVar62._4_2_ =
                         auVar90._4_2_ * in_XMM9._4_2_ + auVar80._4_2_ * sVar41 + in_XMM13._4_2_;
                    auVar62._6_2_ =
                         auVar90._6_2_ * in_XMM9._6_2_ + auVar80._6_2_ * sVar42 + in_XMM13._6_2_;
                    auVar62._8_2_ =
                         auVar90._8_2_ * in_XMM9._8_2_ + auVar80._8_2_ * sVar43 + in_XMM13._8_2_;
                    auVar62._10_2_ =
                         auVar90._10_2_ * in_XMM9._10_2_ + auVar80._10_2_ * sVar44 + in_XMM13._10_2_
                    ;
                    auVar62._12_2_ =
                         auVar90._12_2_ * in_XMM9._12_2_ + auVar80._12_2_ * sVar45 + in_XMM13._12_2_
                    ;
                    auVar62._14_2_ =
                         auVar90._14_2_ * in_XMM9._14_2_ + auVar80._14_2_ * sVar46 + in_XMM13._14_2_
                    ;
                    auVar80 = pmulhuw(auVar62,auVar18);
                    sVar123 = auVar80._0_2_;
                    sVar50 = auVar80._2_2_;
                    sVar52 = auVar80._4_2_;
                    sVar49 = auVar80._6_2_;
                    in_XMM6._0_4_ =
                         CONCAT13((0 < sVar49) * (sVar49 < 0x100) * auVar80[6] - (0xff < sVar49),
                                  CONCAT12((0 < sVar52) * (sVar52 < 0x100) * auVar80[4] -
                                           (0xff < sVar52),
                                           CONCAT11((0 < sVar50) * (sVar50 < 0x100) * auVar80[2] -
                                                    (0xff < sVar50),
                                                    (0 < sVar123) * (sVar123 < 0x100) * auVar80[0] -
                                                    (0xff < sVar123))));
                    sVar67 = auVar80._8_2_;
                    in_XMM6[4] = (0 < sVar67) * (sVar67 < 0x100) * auVar80[8] - (0xff < sVar67);
                    sVar69 = auVar80._10_2_;
                    in_XMM6[5] = (0 < sVar69) * (sVar69 < 0x100) * auVar80[10] - (0xff < sVar69);
                    sVar73 = auVar80._12_2_;
                    in_XMM6[6] = (0 < sVar73) * (sVar73 < 0x100) * auVar80[0xc] - (0xff < sVar73);
                    sVar75 = auVar80._14_2_;
                    in_XMM6[7] = (0 < sVar75) * (sVar75 < 0x100) * auVar80[0xe] - (0xff < sVar75);
                    in_XMM6[8] = (0 < sVar123) * (sVar123 < 0x100) * auVar80[0] - (0xff < sVar123);
                    in_XMM6[9] = (0 < sVar50) * (sVar50 < 0x100) * auVar80[2] - (0xff < sVar50);
                    in_XMM6[10] = (0 < sVar52) * (sVar52 < 0x100) * auVar80[4] - (0xff < sVar52);
                    in_XMM6[0xb] = (0 < sVar49) * (sVar49 < 0x100) * auVar80[6] - (0xff < sVar49);
                    in_XMM6[0xc] = (0 < sVar67) * (sVar67 < 0x100) * auVar80[8] - (0xff < sVar67);
                    in_XMM6[0xd] = (0 < sVar69) * (sVar69 < 0x100) * auVar80[10] - (0xff < sVar69);
                    in_XMM6[0xe] = (0 < sVar73) * (sVar73 < 0x100) * auVar80[0xc] - (0xff < sVar73);
                    in_XMM6[0xf] = (0 < sVar75) * (sVar75 < 0x100) * auVar80[0xe] - (0xff < sVar75);
                    *(undefined4 *)(puVar32 + uVar24 * 4) = in_XMM6._0_4_;
                    uVar24 = uVar24 + 1;
                    auVar80 = auVar107;
                  } while (uVar19 != uVar24);
                }
                uVar29 = auVar107._0_4_;
                BVar30 = uVar23;
              } while (uVar23 != 0);
            }
            uVar33 = uVar33 + 0x800;
            pBVar36 = pBVar36 + 1;
            sVar21 = sVar21 - 1;
          } while (sVar21 != 0);
          uVar33 = (ulong)(self->super_CellRasterizer).super_Rasterizer._width;
          uVar24 = uVar33 - uVar19;
          if (uVar19 <= uVar33 && uVar24 != 0) {
            uVar29 = uVar29 & 0x1ff;
            uVar35 = uVar29 ^ 0x1ff;
            if (uVar29 < 0x100) {
              uVar35 = uVar29;
            }
            if (uVar35 != 0) {
              uVar23 = uVar24 >> 2;
              if (uVar35 == 0xff) {
                if (0x1f < uVar24) {
                  do {
                    *(undefined1 (*) [16])(puVar32 + uVar19 * 4) = auVar38;
                    *(undefined1 (*) [16])(puVar32 + uVar19 * 4 + 0x10) = auVar38;
                    *(undefined1 (*) [16])(puVar32 + uVar19 * 4 + 0x20) = auVar38;
                    *(undefined1 (*) [16])(puVar32 + uVar19 * 4 + 0x30) = auVar38;
                    *(undefined1 (*) [16])(puVar32 + uVar19 * 4 + 0x40) = auVar38;
                    *(undefined1 (*) [16])(puVar32 + uVar19 * 4 + 0x50) = auVar38;
                    *(undefined1 (*) [16])(puVar32 + uVar19 * 4 + 0x60) = auVar38;
                    *(undefined1 (*) [16])(puVar32 + uVar19 * 4 + 0x70) = auVar38;
                    uVar19 = uVar19 + 0x20;
                    uVar23 = uVar23 - 8;
                  } while (7 < uVar23);
                }
                for (; uVar23 != 0; uVar23 = uVar23 - 1) {
                  *(undefined1 (*) [16])(puVar32 + uVar19 * 4) = auVar38;
                  uVar19 = uVar19 + 4;
                }
                if (uVar19 < uVar33) {
                  do {
                    *(uint *)(puVar32 + uVar19 * 4) = uVar31;
                    uVar19 = uVar19 + 1;
                  } while (uVar33 != uVar19);
                }
              }
              else {
                auVar80 = pshuflw(ZEXT416(uVar35),ZEXT416(uVar35),0);
                uVar53 = auVar80._0_4_;
                auVar108._4_4_ = uVar53;
                auVar108._0_4_ = uVar53;
                auVar108._8_4_ = uVar53;
                auVar108._12_4_ = uVar53;
                sVar123 = auVar80._0_2_;
                sVar50 = auVar80._2_2_;
                auVar108 = auVar108 ^ auVar47;
                in_XMM13._0_2_ = sVar123 * sVar37 + sVar101;
                in_XMM13._2_2_ = sVar50 * sVar40 + sVar110;
                in_XMM13._4_2_ = sVar123 * sVar41 + sVar112;
                in_XMM13._6_2_ = sVar50 * sVar42 + sVar114;
                in_XMM13._8_2_ = sVar123 * sVar43 + sVar116;
                in_XMM13._10_2_ = sVar50 * sVar44 + sVar118;
                in_XMM13._12_2_ = sVar123 * sVar45 + sVar120;
                in_XMM13._14_2_ = sVar50 * sVar46 + sVar122;
                sVar101 = auVar108._0_2_;
                sVar110 = auVar108._2_2_;
                sVar112 = auVar108._4_2_;
                sVar114 = auVar108._6_2_;
                sVar116 = auVar108._8_2_;
                sVar118 = auVar108._10_2_;
                sVar120 = auVar108._12_2_;
                sVar122 = auVar108._14_2_;
                if (7 < uVar24) {
                  do {
                    auVar80 = *(undefined1 (*) [16])(puVar32 + uVar19 * 4);
                    auVar90 = *(undefined1 (*) [16])(puVar32 + uVar19 * 4 + 0x10);
                    auVar131 = pmovzxbw(in_XMM15,auVar80);
                    auVar102 = pmovzxbw(in_XMM9,auVar90);
                    auVar64._0_2_ = (ushort)auVar80[8] * sVar101 + in_XMM13._0_2_;
                    auVar64._2_2_ = (ushort)auVar80[9] * sVar110 + in_XMM13._2_2_;
                    auVar64._4_2_ = (ushort)auVar80[10] * sVar112 + in_XMM13._4_2_;
                    auVar64._6_2_ = (ushort)auVar80[0xb] * sVar114 + in_XMM13._6_2_;
                    auVar64._8_2_ = (ushort)auVar80[0xc] * sVar116 + in_XMM13._8_2_;
                    auVar64._10_2_ = (ushort)auVar80[0xd] * sVar118 + in_XMM13._10_2_;
                    auVar64._12_2_ = (ushort)auVar80[0xe] * sVar120 + in_XMM13._12_2_;
                    auVar64._14_2_ = (ushort)auVar80[0xf] * sVar122 + in_XMM13._14_2_;
                    auVar80 = pmulhuw(auVar64,auVar17);
                    auVar144._0_2_ = (ushort)auVar90[8] * sVar101 + in_XMM13._0_2_;
                    auVar144._2_2_ = (ushort)auVar90[9] * sVar110 + in_XMM13._2_2_;
                    auVar144._4_2_ = (ushort)auVar90[10] * sVar112 + in_XMM13._4_2_;
                    auVar144._6_2_ = (ushort)auVar90[0xb] * sVar114 + in_XMM13._6_2_;
                    auVar144._8_2_ = (ushort)auVar90[0xc] * sVar116 + in_XMM13._8_2_;
                    auVar144._10_2_ = (ushort)auVar90[0xd] * sVar118 + in_XMM13._10_2_;
                    auVar144._12_2_ = (ushort)auVar90[0xe] * sVar120 + in_XMM13._12_2_;
                    auVar144._14_2_ = (ushort)auVar90[0xf] * sVar122 + in_XMM13._14_2_;
                    in_XMM14 = pmulhuw(auVar144,auVar17);
                    auVar151._0_2_ = auVar131._0_2_ * sVar101 + in_XMM13._0_2_;
                    auVar151._2_2_ = auVar131._2_2_ * sVar110 + in_XMM13._2_2_;
                    auVar151._4_2_ = auVar131._4_2_ * sVar112 + in_XMM13._4_2_;
                    auVar151._6_2_ = auVar131._6_2_ * sVar114 + in_XMM13._6_2_;
                    auVar151._8_2_ = auVar131._8_2_ * sVar116 + in_XMM13._8_2_;
                    auVar151._10_2_ = auVar131._10_2_ * sVar118 + in_XMM13._10_2_;
                    auVar151._12_2_ = auVar131._12_2_ * sVar120 + in_XMM13._12_2_;
                    auVar151._14_2_ = auVar131._14_2_ * sVar122 + in_XMM13._14_2_;
                    auVar90 = pmulhuw(auVar151,auVar17);
                    sVar52 = auVar90._0_2_;
                    sVar49 = auVar90._2_2_;
                    in_XMM15[1] = (0 < sVar49) * (sVar49 < 0x100) * auVar90[2] - (0xff < sVar49);
                    in_XMM15[0] = (0 < sVar52) * (sVar52 < 0x100) * auVar90[0] - (0xff < sVar52);
                    sVar52 = auVar90._4_2_;
                    in_XMM15[2] = (0 < sVar52) * (sVar52 < 0x100) * auVar90[4] - (0xff < sVar52);
                    sVar52 = auVar90._6_2_;
                    in_XMM15[3] = (0 < sVar52) * (sVar52 < 0x100) * auVar90[6] - (0xff < sVar52);
                    sVar52 = auVar90._8_2_;
                    in_XMM15[4] = (0 < sVar52) * (sVar52 < 0x100) * auVar90[8] - (0xff < sVar52);
                    sVar52 = auVar90._10_2_;
                    in_XMM15[5] = (0 < sVar52) * (sVar52 < 0x100) * auVar90[10] - (0xff < sVar52);
                    sVar52 = auVar90._12_2_;
                    in_XMM15[6] = (0 < sVar52) * (sVar52 < 0x100) * auVar90[0xc] - (0xff < sVar52);
                    sVar52 = auVar90._14_2_;
                    in_XMM15[7] = (0 < sVar52) * (sVar52 < 0x100) * auVar90[0xe] - (0xff < sVar52);
                    sVar52 = auVar80._0_2_;
                    in_XMM15[8] = (0 < sVar52) * (sVar52 < 0x100) * auVar80[0] - (0xff < sVar52);
                    sVar52 = auVar80._2_2_;
                    in_XMM15[9] = (0 < sVar52) * (sVar52 < 0x100) * auVar80[2] - (0xff < sVar52);
                    sVar52 = auVar80._4_2_;
                    in_XMM15[10] = (0 < sVar52) * (sVar52 < 0x100) * auVar80[4] - (0xff < sVar52);
                    sVar52 = auVar80._6_2_;
                    in_XMM15[0xb] = (0 < sVar52) * (sVar52 < 0x100) * auVar80[6] - (0xff < sVar52);
                    sVar52 = auVar80._8_2_;
                    in_XMM15[0xc] = (0 < sVar52) * (sVar52 < 0x100) * auVar80[8] - (0xff < sVar52);
                    sVar52 = auVar80._10_2_;
                    in_XMM15[0xd] = (0 < sVar52) * (sVar52 < 0x100) * auVar80[10] - (0xff < sVar52);
                    sVar52 = auVar80._12_2_;
                    in_XMM15[0xe] = (0 < sVar52) * (sVar52 < 0x100) * auVar80[0xc] - (0xff < sVar52)
                    ;
                    sVar52 = auVar80._14_2_;
                    in_XMM15[0xf] = (0 < sVar52) * (sVar52 < 0x100) * auVar80[0xe] - (0xff < sVar52)
                    ;
                    auVar85._0_2_ = auVar102._0_2_ * sVar101 + in_XMM13._0_2_;
                    auVar85._2_2_ = auVar102._2_2_ * sVar110 + in_XMM13._2_2_;
                    auVar85._4_2_ = auVar102._4_2_ * sVar112 + in_XMM13._4_2_;
                    auVar85._6_2_ = auVar102._6_2_ * sVar114 + in_XMM13._6_2_;
                    auVar85._8_2_ = auVar102._8_2_ * sVar116 + in_XMM13._8_2_;
                    auVar85._10_2_ = auVar102._10_2_ * sVar118 + in_XMM13._10_2_;
                    auVar85._12_2_ = auVar102._12_2_ * sVar120 + in_XMM13._12_2_;
                    auVar85._14_2_ = auVar102._14_2_ * sVar122 + in_XMM13._14_2_;
                    auVar90 = pmulhuw(auVar85,auVar17);
                    sVar52 = auVar90._0_2_;
                    sVar49 = auVar90._2_2_;
                    in_XMM9[1] = (0 < sVar49) * (sVar49 < 0x100) * auVar90[2] - (0xff < sVar49);
                    in_XMM9[0] = (0 < sVar52) * (sVar52 < 0x100) * auVar90[0] - (0xff < sVar52);
                    sVar52 = auVar90._4_2_;
                    in_XMM9[2] = (0 < sVar52) * (sVar52 < 0x100) * auVar90[4] - (0xff < sVar52);
                    sVar52 = auVar90._6_2_;
                    in_XMM9[3] = (0 < sVar52) * (sVar52 < 0x100) * auVar90[6] - (0xff < sVar52);
                    sVar52 = auVar90._8_2_;
                    in_XMM9[4] = (0 < sVar52) * (sVar52 < 0x100) * auVar90[8] - (0xff < sVar52);
                    sVar52 = auVar90._10_2_;
                    in_XMM9[5] = (0 < sVar52) * (sVar52 < 0x100) * auVar90[10] - (0xff < sVar52);
                    sVar52 = auVar90._12_2_;
                    in_XMM9[6] = (0 < sVar52) * (sVar52 < 0x100) * auVar90[0xc] - (0xff < sVar52);
                    sVar52 = auVar90._14_2_;
                    in_XMM9[7] = (0 < sVar52) * (sVar52 < 0x100) * auVar90[0xe] - (0xff < sVar52);
                    sVar52 = in_XMM14._0_2_;
                    in_XMM9[8] = (0 < sVar52) * (sVar52 < 0x100) * in_XMM14[0] - (0xff < sVar52);
                    sVar52 = in_XMM14._2_2_;
                    in_XMM9[9] = (0 < sVar52) * (sVar52 < 0x100) * in_XMM14[2] - (0xff < sVar52);
                    sVar52 = in_XMM14._4_2_;
                    in_XMM9[10] = (0 < sVar52) * (sVar52 < 0x100) * in_XMM14[4] - (0xff < sVar52);
                    sVar52 = in_XMM14._6_2_;
                    in_XMM9[0xb] = (0 < sVar52) * (sVar52 < 0x100) * in_XMM14[6] - (0xff < sVar52);
                    sVar52 = in_XMM14._8_2_;
                    in_XMM9[0xc] = (0 < sVar52) * (sVar52 < 0x100) * in_XMM14[8] - (0xff < sVar52);
                    sVar52 = in_XMM14._10_2_;
                    in_XMM9[0xd] = (0 < sVar52) * (sVar52 < 0x100) * in_XMM14[10] - (0xff < sVar52);
                    sVar52 = in_XMM14._12_2_;
                    in_XMM9[0xe] = (0 < sVar52) * (sVar52 < 0x100) * in_XMM14[0xc] - (0xff < sVar52)
                    ;
                    sVar52 = in_XMM14._14_2_;
                    in_XMM9[0xf] = (0 < sVar52) * (sVar52 < 0x100) * in_XMM14[0xe] - (0xff < sVar52)
                    ;
                    *(undefined1 (*) [16])(puVar32 + uVar19 * 4) = in_XMM15;
                    *(undefined1 (*) [16])(puVar32 + uVar19 * 4 + 0x10) = in_XMM9;
                    uVar19 = uVar19 + 8;
                    uVar23 = uVar23 - 2;
                  } while (1 < uVar23);
                }
                if (uVar23 != 0) {
                  auVar80 = *(undefined1 (*) [16])(puVar32 + uVar19 * 4);
                  auVar90 = pmovzxbw(in_XMM9,auVar80);
                  auVar65._0_2_ = (ushort)auVar80[8] * sVar101 + in_XMM13._0_2_;
                  auVar65._2_2_ = (ushort)auVar80[9] * sVar110 + in_XMM13._2_2_;
                  auVar65._4_2_ = (ushort)auVar80[10] * sVar112 + in_XMM13._4_2_;
                  auVar65._6_2_ = (ushort)auVar80[0xb] * sVar114 + in_XMM13._6_2_;
                  auVar65._8_2_ = (ushort)auVar80[0xc] * sVar116 + in_XMM13._8_2_;
                  auVar65._10_2_ = (ushort)auVar80[0xd] * sVar118 + in_XMM13._10_2_;
                  auVar65._12_2_ = (ushort)auVar80[0xe] * sVar120 + in_XMM13._12_2_;
                  auVar65._14_2_ = (ushort)auVar80[0xf] * sVar122 + in_XMM13._14_2_;
                  auVar80 = pmulhuw(auVar65,auVar17);
                  auVar86._0_2_ = auVar90._0_2_ * sVar101 + in_XMM13._0_2_;
                  auVar86._2_2_ = auVar90._2_2_ * sVar110 + in_XMM13._2_2_;
                  auVar86._4_2_ = auVar90._4_2_ * sVar112 + in_XMM13._4_2_;
                  auVar86._6_2_ = auVar90._6_2_ * sVar114 + in_XMM13._6_2_;
                  auVar86._8_2_ = auVar90._8_2_ * sVar116 + in_XMM13._8_2_;
                  auVar86._10_2_ = auVar90._10_2_ * sVar118 + in_XMM13._10_2_;
                  auVar86._12_2_ = auVar90._12_2_ * sVar120 + in_XMM13._12_2_;
                  auVar86._14_2_ = auVar90._14_2_ * sVar122 + in_XMM13._14_2_;
                  auVar90 = pmulhuw(auVar86,auVar17);
                  sVar52 = auVar90._0_2_;
                  sVar49 = auVar90._2_2_;
                  in_XMM9[1] = (0 < sVar49) * (sVar49 < 0x100) * auVar90[2] - (0xff < sVar49);
                  in_XMM9[0] = (0 < sVar52) * (sVar52 < 0x100) * auVar90[0] - (0xff < sVar52);
                  sVar52 = auVar90._4_2_;
                  in_XMM9[2] = (0 < sVar52) * (sVar52 < 0x100) * auVar90[4] - (0xff < sVar52);
                  sVar52 = auVar90._6_2_;
                  in_XMM9[3] = (0 < sVar52) * (sVar52 < 0x100) * auVar90[6] - (0xff < sVar52);
                  sVar52 = auVar90._8_2_;
                  in_XMM9[4] = (0 < sVar52) * (sVar52 < 0x100) * auVar90[8] - (0xff < sVar52);
                  sVar52 = auVar90._10_2_;
                  in_XMM9[5] = (0 < sVar52) * (sVar52 < 0x100) * auVar90[10] - (0xff < sVar52);
                  sVar52 = auVar90._12_2_;
                  in_XMM9[6] = (0 < sVar52) * (sVar52 < 0x100) * auVar90[0xc] - (0xff < sVar52);
                  sVar52 = auVar90._14_2_;
                  in_XMM9[7] = (0 < sVar52) * (sVar52 < 0x100) * auVar90[0xe] - (0xff < sVar52);
                  sVar52 = auVar80._0_2_;
                  in_XMM9[8] = (0 < sVar52) * (sVar52 < 0x100) * auVar80[0] - (0xff < sVar52);
                  sVar52 = auVar80._2_2_;
                  in_XMM9[9] = (0 < sVar52) * (sVar52 < 0x100) * auVar80[2] - (0xff < sVar52);
                  sVar52 = auVar80._4_2_;
                  in_XMM9[10] = (0 < sVar52) * (sVar52 < 0x100) * auVar80[4] - (0xff < sVar52);
                  sVar52 = auVar80._6_2_;
                  in_XMM9[0xb] = (0 < sVar52) * (sVar52 < 0x100) * auVar80[6] - (0xff < sVar52);
                  sVar52 = auVar80._8_2_;
                  in_XMM9[0xc] = (0 < sVar52) * (sVar52 < 0x100) * auVar80[8] - (0xff < sVar52);
                  sVar52 = auVar80._10_2_;
                  in_XMM9[0xd] = (0 < sVar52) * (sVar52 < 0x100) * auVar80[10] - (0xff < sVar52);
                  sVar52 = auVar80._12_2_;
                  in_XMM9[0xe] = (0 < sVar52) * (sVar52 < 0x100) * auVar80[0xc] - (0xff < sVar52);
                  sVar52 = auVar80._14_2_;
                  in_XMM9[0xf] = (0 < sVar52) * (sVar52 < 0x100) * auVar80[0xe] - (0xff < sVar52);
                  *(undefined1 (*) [16])(puVar32 + uVar19 * 4) = in_XMM9;
                  uVar19 = uVar19 + 4;
                }
                in_XMM6 = pmovzxbw(auVar80,0x8080808080808080);
                if (uVar19 < uVar33) {
                  sVar52 = in_XMM6._0_2_;
                  sVar49 = in_XMM6._2_2_;
                  sVar67 = in_XMM6._4_2_;
                  sVar69 = in_XMM6._6_2_;
                  sVar73 = in_XMM6._8_2_;
                  sVar75 = in_XMM6._10_2_;
                  sVar77 = in_XMM6._12_2_;
                  sVar79 = in_XMM6._14_2_;
                  do {
                    auVar80 = pmovzxbw(ZEXT416(*(uint *)(puVar32 + uVar19 * 4)),
                                       ZEXT416(*(uint *)(puVar32 + uVar19 * 4)));
                    auVar66._0_2_ = auVar80._0_2_ * sVar101 + sVar123 * sVar37 + sVar52;
                    auVar66._2_2_ = auVar80._2_2_ * sVar110 + sVar50 * sVar40 + sVar49;
                    auVar66._4_2_ = auVar80._4_2_ * sVar112 + sVar123 * sVar41 + sVar67;
                    auVar66._6_2_ = auVar80._6_2_ * sVar114 + sVar50 * sVar42 + sVar69;
                    auVar66._8_2_ = auVar80._8_2_ * sVar116 + sVar123 * sVar43 + sVar73;
                    auVar66._10_2_ = auVar80._10_2_ * sVar118 + sVar50 * sVar44 + sVar75;
                    auVar66._12_2_ = auVar80._12_2_ * sVar120 + sVar123 * sVar45 + sVar77;
                    auVar66._14_2_ = auVar80._14_2_ * sVar122 + sVar50 * sVar46 + sVar79;
                    auVar80 = pmulhuw(auVar66,auVar18);
                    sVar51 = auVar80._0_2_;
                    sVar68 = auVar80._2_2_;
                    sVar70 = auVar80._4_2_;
                    sVar71 = auVar80._6_2_;
                    in_XMM6._0_4_ =
                         CONCAT13((0 < sVar71) * (sVar71 < 0x100) * auVar80[6] - (0xff < sVar71),
                                  CONCAT12((0 < sVar70) * (sVar70 < 0x100) * auVar80[4] -
                                           (0xff < sVar70),
                                           CONCAT11((0 < sVar68) * (sVar68 < 0x100) * auVar80[2] -
                                                    (0xff < sVar68),
                                                    (0 < sVar51) * (sVar51 < 0x100) * auVar80[0] -
                                                    (0xff < sVar51))));
                    sVar72 = auVar80._8_2_;
                    in_XMM6[4] = (0 < sVar72) * (sVar72 < 0x100) * auVar80[8] - (0xff < sVar72);
                    sVar74 = auVar80._10_2_;
                    in_XMM6[5] = (0 < sVar74) * (sVar74 < 0x100) * auVar80[10] - (0xff < sVar74);
                    sVar76 = auVar80._12_2_;
                    in_XMM6[6] = (0 < sVar76) * (sVar76 < 0x100) * auVar80[0xc] - (0xff < sVar76);
                    sVar78 = auVar80._14_2_;
                    in_XMM6[7] = (0 < sVar78) * (sVar78 < 0x100) * auVar80[0xe] - (0xff < sVar78);
                    in_XMM6[8] = (0 < sVar51) * (sVar51 < 0x100) * auVar80[0] - (0xff < sVar51);
                    in_XMM6[9] = (0 < sVar68) * (sVar68 < 0x100) * auVar80[2] - (0xff < sVar68);
                    in_XMM6[10] = (0 < sVar70) * (sVar70 < 0x100) * auVar80[4] - (0xff < sVar70);
                    in_XMM6[0xb] = (0 < sVar71) * (sVar71 < 0x100) * auVar80[6] - (0xff < sVar71);
                    in_XMM6[0xc] = (0 < sVar72) * (sVar72 < 0x100) * auVar80[8] - (0xff < sVar72);
                    in_XMM6[0xd] = (0 < sVar74) * (sVar74 < 0x100) * auVar80[10] - (0xff < sVar74);
                    in_XMM6[0xe] = (0 < sVar76) * (sVar76 < 0x100) * auVar80[0xc] - (0xff < sVar76);
                    in_XMM6[0xf] = (0 < sVar78) * (sVar78 < 0x100) * auVar80[0xe] - (0xff < sVar78);
                    *(undefined4 *)(puVar32 + uVar19 * 4) = in_XMM6._0_4_;
                    uVar19 = uVar19 + 1;
                  } while (uVar33 != uVar19);
                }
              }
            }
          }
          puVar32 = puVar32 + lVar6;
          pCVar25 = pCVar25 + self->_cellStride;
          uVar34 = uVar34 + 1;
        } while (uVar34 <= (ulong)(long)(int)uVar4);
      }
      (self->_yBounds).start = 0x7fffffff;
      (self->_yBounds).end = 0;
      return;
    }
    RasterizerA3<32u>::_renderImpl<CompositorScalar,false>((RasterizerA3<32u> *)self,argb32);
    return;
  }
  if ((uVar31 & 1) != 0) {
    uVar31 = (self->_yBounds).start;
    uVar34 = (ulong)(int)uVar31;
    uVar4 = (self->_yBounds).end;
    if (uVar31 <= uVar4) {
      pIVar5 = (self->super_CellRasterizer).super_Rasterizer._dst;
      lVar6 = pIVar5->_stride;
      iVar27 = (argb32 & 0xff00ff) * (argb32 >> 0x18);
      iVar22 = (bVar14 | 0xff0000) * (argb32 >> 0x18);
      uVar31 = (iVar27 + 0x800080U >> 8 & 0xff00ff) + iVar27 + 0x800080 >> 8 & 0xff00ff |
               iVar22 + (iVar22 + 0x800080U >> 8 & 0xff00ff) + 0x800080 & 0xff00ff00;
      auVar39._4_4_ = uVar31;
      auVar39._0_4_ = uVar31;
      auVar39._8_4_ = uVar31;
      auVar39._12_4_ = uVar31;
      auVar38 = pmovzxbw(in_XMM1,auVar39);
      puVar32 = pIVar5->_data + lVar6 * uVar34;
      pCVar25 = self->_cells + self->_cellStride * uVar34;
      pBVar36 = self->_bits + self->_bitStride * uVar34;
      auVar47 = pmovzxbw(in_XMM2,0xffffffffffffffff);
      auVar48 = pmovzxbw(in_XMM3,0x8080808080808080);
      auVar55 = pmovzxbw(in_XMM6,0x8080808080808080);
      auVar80 = pmovzxbw(in_XMM8,0xffffffffffffffff);
      do {
        sVar21 = self->_bitStride;
        uVar29 = 0;
        uVar19 = 0;
        uVar33 = 0;
        do {
          BVar30 = *pBVar36;
          *pBVar36 = 0;
          sVar101 = auVar48._0_2_;
          sVar110 = auVar48._2_2_;
          sVar112 = auVar48._4_2_;
          sVar114 = auVar48._6_2_;
          sVar116 = auVar48._8_2_;
          sVar118 = auVar48._10_2_;
          sVar120 = auVar48._12_2_;
          sVar122 = auVar48._14_2_;
          sVar37 = auVar38._0_2_;
          sVar40 = auVar38._2_2_;
          sVar41 = auVar38._4_2_;
          sVar42 = auVar38._6_2_;
          sVar43 = auVar38._8_2_;
          sVar44 = auVar38._10_2_;
          sVar45 = auVar38._12_2_;
          sVar46 = auVar38._14_2_;
          sVar123 = auVar55._0_2_;
          sVar50 = auVar55._2_2_;
          sVar52 = auVar55._4_2_;
          sVar49 = auVar55._6_2_;
          sVar67 = auVar55._8_2_;
          sVar69 = auVar55._10_2_;
          sVar73 = auVar55._12_2_;
          sVar75 = auVar55._14_2_;
          if (BVar30 != 0) {
            do {
              lVar7 = 0;
              if (BVar30 != 0) {
                for (; (BVar30 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
                }
              }
              uVar28 = -1L << ((byte)lVar7 & 0x3f);
              uVar23 = (uint)((int)lVar7 << 5) | uVar33;
              uVar26 = uVar23 - uVar19;
              uVar24 = uVar19;
              if (uVar19 <= uVar23 && uVar26 != 0) {
                uVar35 = -uVar29;
                if (0 < (int)uVar29) {
                  uVar35 = uVar29;
                }
                uVar87 = 0xff;
                if ((int)uVar35 < 0xff) {
                  uVar87 = uVar35;
                }
                uVar24 = uVar23;
                if (uVar29 != 0) {
                  uVar20 = uVar26 >> 2;
                  if (uVar35 < 0xff) {
                    auVar90 = pshuflw(ZEXT416(uVar87),ZEXT416(uVar87),0);
                    auVar81._0_4_ = auVar90._0_4_;
                    auVar81._4_4_ = auVar81._0_4_;
                    auVar81._8_4_ = auVar81._0_4_;
                    auVar81._12_4_ = auVar81._0_4_;
                    sVar76 = auVar90._0_2_;
                    sVar78 = auVar90._2_2_;
                    auVar81 = auVar81 ^ auVar47;
                    sVar100 = sVar76 * sVar37 + sVar101;
                    sVar109 = sVar78 * sVar40 + sVar110;
                    sVar111 = sVar76 * sVar41 + sVar112;
                    sVar113 = sVar78 * sVar42 + sVar114;
                    sVar115 = sVar76 * sVar43 + sVar116;
                    sVar117 = sVar78 * sVar44 + sVar118;
                    sVar119 = sVar76 * sVar45 + sVar120;
                    sVar121 = sVar78 * sVar46 + sVar122;
                    sVar77 = auVar81._0_2_;
                    sVar79 = auVar81._2_2_;
                    sVar51 = auVar81._4_2_;
                    sVar68 = auVar81._6_2_;
                    sVar70 = auVar81._8_2_;
                    sVar71 = auVar81._10_2_;
                    sVar72 = auVar81._12_2_;
                    sVar74 = auVar81._14_2_;
                    if (7 < uVar26) {
                      do {
                        auVar90 = *(undefined1 (*) [16])(puVar32 + uVar19 * 4);
                        auVar102 = *(undefined1 (*) [16])(puVar32 + uVar19 * 4 + 0x10);
                        auVar131 = pmovzxbw(in_XMM13,auVar90);
                        auVar147 = pmovzxbw(in_XMM15,auVar102);
                        auVar140._0_2_ = (ushort)auVar90[8] * sVar77 + sVar100;
                        auVar140._2_2_ = (ushort)auVar90[9] * sVar79 + sVar109;
                        auVar140._4_2_ = (ushort)auVar90[10] * sVar51 + sVar111;
                        auVar140._6_2_ = (ushort)auVar90[0xb] * sVar68 + sVar113;
                        auVar140._8_2_ = (ushort)auVar90[0xc] * sVar70 + sVar115;
                        auVar140._10_2_ = (ushort)auVar90[0xd] * sVar71 + sVar117;
                        auVar140._12_2_ = (ushort)auVar90[0xe] * sVar72 + sVar119;
                        auVar140._14_2_ = (ushort)auVar90[0xf] * sVar74 + sVar121;
                        auVar142 = pmulhuw(auVar140,auVar17);
                        auVar124._0_2_ = (ushort)auVar102[8] * sVar77 + sVar100;
                        auVar124._2_2_ = (ushort)auVar102[9] * sVar79 + sVar109;
                        auVar124._4_2_ = (ushort)auVar102[10] * sVar51 + sVar111;
                        auVar124._6_2_ = (ushort)auVar102[0xb] * sVar68 + sVar113;
                        auVar124._8_2_ = (ushort)auVar102[0xc] * sVar70 + sVar115;
                        auVar124._10_2_ = (ushort)auVar102[0xd] * sVar71 + sVar117;
                        auVar124._12_2_ = (ushort)auVar102[0xe] * sVar72 + sVar119;
                        auVar124._14_2_ = (ushort)auVar102[0xf] * sVar74 + sVar121;
                        auVar90 = pmulhuw(auVar124,auVar17);
                        auVar129._0_2_ = auVar131._0_2_ * sVar77 + sVar100;
                        auVar129._2_2_ = auVar131._2_2_ * sVar79 + sVar109;
                        auVar129._4_2_ = auVar131._4_2_ * sVar51 + sVar111;
                        auVar129._6_2_ = auVar131._6_2_ * sVar68 + sVar113;
                        auVar129._8_2_ = auVar131._8_2_ * sVar70 + sVar115;
                        auVar129._10_2_ = auVar131._10_2_ * sVar71 + sVar117;
                        auVar129._12_2_ = auVar131._12_2_ * sVar72 + sVar119;
                        auVar129._14_2_ = auVar131._14_2_ * sVar74 + sVar121;
                        auVar102 = pmulhuw(auVar129,auVar17);
                        sVar8 = auVar102._0_2_;
                        sVar9 = auVar102._2_2_;
                        in_XMM13[1] = (0 < sVar9) * (sVar9 < 0x100) * auVar102[2] - (0xff < sVar9);
                        in_XMM13[0] = (0 < sVar8) * (sVar8 < 0x100) * auVar102[0] - (0xff < sVar8);
                        sVar8 = auVar102._4_2_;
                        in_XMM13[2] = (0 < sVar8) * (sVar8 < 0x100) * auVar102[4] - (0xff < sVar8);
                        sVar8 = auVar102._6_2_;
                        in_XMM13[3] = (0 < sVar8) * (sVar8 < 0x100) * auVar102[6] - (0xff < sVar8);
                        sVar8 = auVar102._8_2_;
                        in_XMM13[4] = (0 < sVar8) * (sVar8 < 0x100) * auVar102[8] - (0xff < sVar8);
                        sVar8 = auVar102._10_2_;
                        in_XMM13[5] = (0 < sVar8) * (sVar8 < 0x100) * auVar102[10] - (0xff < sVar8);
                        sVar8 = auVar102._12_2_;
                        in_XMM13[6] = (0 < sVar8) * (sVar8 < 0x100) * auVar102[0xc] - (0xff < sVar8)
                        ;
                        sVar8 = auVar102._14_2_;
                        in_XMM13[7] = (0 < sVar8) * (sVar8 < 0x100) * auVar102[0xe] - (0xff < sVar8)
                        ;
                        sVar8 = auVar142._0_2_;
                        in_XMM13[8] = (0 < sVar8) * (sVar8 < 0x100) * auVar142[0] - (0xff < sVar8);
                        sVar8 = auVar142._2_2_;
                        in_XMM13[9] = (0 < sVar8) * (sVar8 < 0x100) * auVar142[2] - (0xff < sVar8);
                        sVar8 = auVar142._4_2_;
                        in_XMM13[10] = (0 < sVar8) * (sVar8 < 0x100) * auVar142[4] - (0xff < sVar8);
                        sVar8 = auVar142._6_2_;
                        in_XMM13[0xb] = (0 < sVar8) * (sVar8 < 0x100) * auVar142[6] - (0xff < sVar8)
                        ;
                        sVar8 = auVar142._8_2_;
                        in_XMM13[0xc] = (0 < sVar8) * (sVar8 < 0x100) * auVar142[8] - (0xff < sVar8)
                        ;
                        sVar8 = auVar142._10_2_;
                        in_XMM13[0xd] =
                             (0 < sVar8) * (sVar8 < 0x100) * auVar142[10] - (0xff < sVar8);
                        sVar8 = auVar142._12_2_;
                        in_XMM13[0xe] =
                             (0 < sVar8) * (sVar8 < 0x100) * auVar142[0xc] - (0xff < sVar8);
                        sVar8 = auVar142._14_2_;
                        in_XMM13[0xf] =
                             (0 < sVar8) * (sVar8 < 0x100) * auVar142[0xe] - (0xff < sVar8);
                        auVar146._0_2_ = auVar147._0_2_ * sVar77 + sVar100;
                        auVar146._2_2_ = auVar147._2_2_ * sVar79 + sVar109;
                        auVar146._4_2_ = auVar147._4_2_ * sVar51 + sVar111;
                        auVar146._6_2_ = auVar147._6_2_ * sVar68 + sVar113;
                        auVar146._8_2_ = auVar147._8_2_ * sVar70 + sVar115;
                        auVar146._10_2_ = auVar147._10_2_ * sVar71 + sVar117;
                        auVar146._12_2_ = auVar147._12_2_ * sVar72 + sVar119;
                        auVar146._14_2_ = auVar147._14_2_ * sVar74 + sVar121;
                        auVar102 = pmulhuw(auVar146,auVar17);
                        sVar8 = auVar102._0_2_;
                        sVar9 = auVar102._2_2_;
                        in_XMM15[1] = (0 < sVar9) * (sVar9 < 0x100) * auVar102[2] - (0xff < sVar9);
                        in_XMM15[0] = (0 < sVar8) * (sVar8 < 0x100) * auVar102[0] - (0xff < sVar8);
                        sVar8 = auVar102._4_2_;
                        in_XMM15[2] = (0 < sVar8) * (sVar8 < 0x100) * auVar102[4] - (0xff < sVar8);
                        sVar8 = auVar102._6_2_;
                        in_XMM15[3] = (0 < sVar8) * (sVar8 < 0x100) * auVar102[6] - (0xff < sVar8);
                        sVar8 = auVar102._8_2_;
                        in_XMM15[4] = (0 < sVar8) * (sVar8 < 0x100) * auVar102[8] - (0xff < sVar8);
                        sVar8 = auVar102._10_2_;
                        in_XMM15[5] = (0 < sVar8) * (sVar8 < 0x100) * auVar102[10] - (0xff < sVar8);
                        sVar8 = auVar102._12_2_;
                        in_XMM15[6] = (0 < sVar8) * (sVar8 < 0x100) * auVar102[0xc] - (0xff < sVar8)
                        ;
                        sVar8 = auVar102._14_2_;
                        in_XMM15[7] = (0 < sVar8) * (sVar8 < 0x100) * auVar102[0xe] - (0xff < sVar8)
                        ;
                        sVar8 = auVar90._0_2_;
                        in_XMM15[8] = (0 < sVar8) * (sVar8 < 0x100) * auVar90[0] - (0xff < sVar8);
                        sVar8 = auVar90._2_2_;
                        in_XMM15[9] = (0 < sVar8) * (sVar8 < 0x100) * auVar90[2] - (0xff < sVar8);
                        sVar8 = auVar90._4_2_;
                        in_XMM15[10] = (0 < sVar8) * (sVar8 < 0x100) * auVar90[4] - (0xff < sVar8);
                        sVar8 = auVar90._6_2_;
                        in_XMM15[0xb] = (0 < sVar8) * (sVar8 < 0x100) * auVar90[6] - (0xff < sVar8);
                        sVar8 = auVar90._8_2_;
                        in_XMM15[0xc] = (0 < sVar8) * (sVar8 < 0x100) * auVar90[8] - (0xff < sVar8);
                        sVar8 = auVar90._10_2_;
                        in_XMM15[0xd] = (0 < sVar8) * (sVar8 < 0x100) * auVar90[10] - (0xff < sVar8)
                        ;
                        sVar8 = auVar90._12_2_;
                        in_XMM15[0xe] =
                             (0 < sVar8) * (sVar8 < 0x100) * auVar90[0xc] - (0xff < sVar8);
                        sVar8 = auVar90._14_2_;
                        in_XMM15[0xf] =
                             (0 < sVar8) * (sVar8 < 0x100) * auVar90[0xe] - (0xff < sVar8);
                        *(undefined1 (*) [16])(puVar32 + uVar19 * 4) = in_XMM13;
                        *(undefined1 (*) [16])(puVar32 + uVar19 * 4 + 0x10) = in_XMM15;
                        uVar19 = uVar19 + 8;
                        uVar20 = uVar20 - 2;
                      } while (1 < uVar20);
                    }
                    if (uVar20 != 0) {
                      auVar90 = *(undefined1 (*) [16])(puVar32 + uVar19 * 4);
                      auVar102 = pmovzxbw(in_XMM13,auVar90);
                      auVar125._0_2_ = (ushort)auVar90[8] * sVar77 + sVar100;
                      auVar125._2_2_ = (ushort)auVar90[9] * sVar79 + sVar109;
                      auVar125._4_2_ = (ushort)auVar90[10] * sVar51 + sVar111;
                      auVar125._6_2_ = (ushort)auVar90[0xb] * sVar68 + sVar113;
                      auVar125._8_2_ = (ushort)auVar90[0xc] * sVar70 + sVar115;
                      auVar125._10_2_ = (ushort)auVar90[0xd] * sVar71 + sVar117;
                      auVar125._12_2_ = (ushort)auVar90[0xe] * sVar72 + sVar119;
                      auVar125._14_2_ = (ushort)auVar90[0xf] * sVar74 + sVar121;
                      auVar90 = pmulhuw(auVar125,auVar17);
                      auVar130._0_2_ = auVar102._0_2_ * sVar77 + sVar100;
                      auVar130._2_2_ = auVar102._2_2_ * sVar79 + sVar109;
                      auVar130._4_2_ = auVar102._4_2_ * sVar51 + sVar111;
                      auVar130._6_2_ = auVar102._6_2_ * sVar68 + sVar113;
                      auVar130._8_2_ = auVar102._8_2_ * sVar70 + sVar115;
                      auVar130._10_2_ = auVar102._10_2_ * sVar71 + sVar117;
                      auVar130._12_2_ = auVar102._12_2_ * sVar72 + sVar119;
                      auVar130._14_2_ = auVar102._14_2_ * sVar74 + sVar121;
                      auVar102 = pmulhuw(auVar130,auVar17);
                      sVar100 = auVar102._0_2_;
                      sVar109 = auVar102._2_2_;
                      in_XMM13[1] = (0 < sVar109) * (sVar109 < 0x100) * auVar102[2] -
                                    (0xff < sVar109);
                      in_XMM13[0] = (0 < sVar100) * (sVar100 < 0x100) * auVar102[0] -
                                    (0xff < sVar100);
                      sVar100 = auVar102._4_2_;
                      in_XMM13[2] = (0 < sVar100) * (sVar100 < 0x100) * auVar102[4] -
                                    (0xff < sVar100);
                      sVar100 = auVar102._6_2_;
                      in_XMM13[3] = (0 < sVar100) * (sVar100 < 0x100) * auVar102[6] -
                                    (0xff < sVar100);
                      sVar100 = auVar102._8_2_;
                      in_XMM13[4] = (0 < sVar100) * (sVar100 < 0x100) * auVar102[8] -
                                    (0xff < sVar100);
                      sVar100 = auVar102._10_2_;
                      in_XMM13[5] = (0 < sVar100) * (sVar100 < 0x100) * auVar102[10] -
                                    (0xff < sVar100);
                      sVar100 = auVar102._12_2_;
                      in_XMM13[6] = (0 < sVar100) * (sVar100 < 0x100) * auVar102[0xc] -
                                    (0xff < sVar100);
                      sVar100 = auVar102._14_2_;
                      in_XMM13[7] = (0 < sVar100) * (sVar100 < 0x100) * auVar102[0xe] -
                                    (0xff < sVar100);
                      sVar100 = auVar90._0_2_;
                      in_XMM13[8] = (0 < sVar100) * (sVar100 < 0x100) * auVar90[0] -
                                    (0xff < sVar100);
                      sVar100 = auVar90._2_2_;
                      in_XMM13[9] = (0 < sVar100) * (sVar100 < 0x100) * auVar90[2] -
                                    (0xff < sVar100);
                      sVar100 = auVar90._4_2_;
                      in_XMM13[10] = (0 < sVar100) * (sVar100 < 0x100) * auVar90[4] -
                                     (0xff < sVar100);
                      sVar100 = auVar90._6_2_;
                      in_XMM13[0xb] =
                           (0 < sVar100) * (sVar100 < 0x100) * auVar90[6] - (0xff < sVar100);
                      sVar100 = auVar90._8_2_;
                      in_XMM13[0xc] =
                           (0 < sVar100) * (sVar100 < 0x100) * auVar90[8] - (0xff < sVar100);
                      sVar100 = auVar90._10_2_;
                      in_XMM13[0xd] =
                           (0 < sVar100) * (sVar100 < 0x100) * auVar90[10] - (0xff < sVar100);
                      sVar100 = auVar90._12_2_;
                      in_XMM13[0xe] =
                           (0 < sVar100) * (sVar100 < 0x100) * auVar90[0xc] - (0xff < sVar100);
                      sVar100 = auVar90._14_2_;
                      in_XMM13[0xf] =
                           (0 < sVar100) * (sVar100 < 0x100) * auVar90[0xe] - (0xff < sVar100);
                      *(undefined1 (*) [16])(puVar32 + uVar19 * 4) = in_XMM13;
                      uVar19 = uVar19 + 4;
                    }
                    if (uVar19 < uVar23) {
                      do {
                        auVar90 = pmovzxbw(ZEXT416(*(uint *)(puVar32 + uVar19 * 4)),
                                           ZEXT416(*(uint *)(puVar32 + uVar19 * 4)));
                        auVar105._0_2_ = auVar90._0_2_ * sVar77 + sVar76 * sVar37 + sVar123;
                        auVar105._2_2_ = auVar90._2_2_ * sVar79 + sVar78 * sVar40 + sVar50;
                        auVar105._4_2_ = auVar90._4_2_ * sVar51 + sVar76 * sVar41 + sVar52;
                        auVar105._6_2_ = auVar90._6_2_ * sVar68 + sVar78 * sVar42 + sVar49;
                        auVar105._8_2_ = auVar90._8_2_ * sVar70 + sVar76 * sVar43 + sVar67;
                        auVar105._10_2_ = auVar90._10_2_ * sVar71 + sVar78 * sVar44 + sVar69;
                        auVar105._12_2_ = auVar90._12_2_ * sVar72 + sVar76 * sVar45 + sVar73;
                        auVar105._14_2_ = auVar90._14_2_ * sVar74 + sVar78 * sVar46 + sVar75;
                        auVar90 = pmulhuw(auVar105,auVar18);
                        sVar100 = auVar90._0_2_;
                        sVar109 = auVar90._2_2_;
                        sVar111 = auVar90._4_2_;
                        sVar113 = auVar90._6_2_;
                        *(uint *)(puVar32 + uVar19 * 4) =
                             CONCAT13((0 < sVar113) * (sVar113 < 0x100) * auVar90[6] -
                                      (0xff < sVar113),
                                      CONCAT12((0 < sVar111) * (sVar111 < 0x100) * auVar90[4] -
                                               (0xff < sVar111),
                                               CONCAT11((0 < sVar109) * (sVar109 < 0x100) *
                                                        auVar90[2] - (0xff < sVar109),
                                                        (0 < sVar100) * (sVar100 < 0x100) *
                                                        auVar90[0] - (0xff < sVar100))));
                        uVar19 = uVar19 + 1;
                      } while (uVar19 < uVar23);
                    }
                  }
                  else {
                    if (0x1f < uVar26) {
                      do {
                        *(undefined1 (*) [16])(puVar32 + uVar19 * 4) = auVar39;
                        *(undefined1 (*) [16])(puVar32 + uVar19 * 4 + 0x10) = auVar39;
                        *(undefined1 (*) [16])(puVar32 + uVar19 * 4 + 0x20) = auVar39;
                        *(undefined1 (*) [16])(puVar32 + uVar19 * 4 + 0x30) = auVar39;
                        *(undefined1 (*) [16])(puVar32 + uVar19 * 4 + 0x40) = auVar39;
                        *(undefined1 (*) [16])(puVar32 + uVar19 * 4 + 0x50) = auVar39;
                        *(undefined1 (*) [16])(puVar32 + uVar19 * 4 + 0x60) = auVar39;
                        *(undefined1 (*) [16])(puVar32 + uVar19 * 4 + 0x70) = auVar39;
                        uVar19 = uVar19 + 0x20;
                        uVar20 = uVar20 - 8;
                      } while (7 < uVar20);
                    }
                    for (; uVar20 != 0; uVar20 = uVar20 - 1) {
                      *(undefined1 (*) [16])(puVar32 + uVar19 * 4) = auVar39;
                      uVar19 = uVar19 + 4;
                    }
                    for (; uVar19 < uVar23; uVar19 = uVar19 + 1) {
                      *(uint *)(puVar32 + uVar19 * 4) = uVar31;
                    }
                  }
                }
              }
              uVar23 = uVar28 ^ BVar30;
              if (BVar30 == uVar28) {
                uVar19 = (ulong)(self->super_CellRasterizer).super_Rasterizer._width;
                if (uVar33 + 0x800 < uVar19) {
                  uVar19 = uVar33 + 0x800;
                }
              }
              else {
                lVar7 = 0;
                if (uVar23 != 0) {
                  for (; (uVar23 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
                  }
                }
                uVar23 = -1L << ((byte)lVar7 & 0x3f) ^ uVar23;
                uVar19 = (uint)((int)lVar7 << 5) | uVar33;
              }
              sVar77 = auVar47._0_2_;
              sVar79 = auVar47._2_2_;
              sVar51 = auVar47._4_2_;
              sVar68 = auVar47._6_2_;
              sVar70 = auVar47._8_2_;
              sVar71 = auVar47._10_2_;
              sVar72 = auVar47._12_2_;
              sVar74 = auVar47._14_2_;
              uVar35 = 0;
              if (3 < uVar19 - uVar24) {
                uVar26 = uVar19 - uVar24 >> 2;
                do {
                  pCVar1 = pCVar25 + uVar24;
                  iVar22 = pCVar1->cover;
                  pCVar3 = pCVar25 + uVar24 + 2;
                  iVar135 = iVar22 + pCVar1[1].cover;
                  auVar15._4_4_ = iVar135;
                  auVar15._0_4_ = iVar22;
                  auVar89._0_4_ = pCVar1->area >> 9;
                  auVar89._4_4_ = pCVar1[1].area >> 9;
                  auVar89._8_4_ = pCVar3->area >> 9;
                  auVar89._12_4_ = pCVar3[1].area >> 9;
                  auVar15._8_8_ = 0;
                  iVar27 = iVar22 + uVar29;
                  iVar136 = iVar135 + uVar29;
                  iVar137 = pCVar1[1].cover + pCVar3->cover + uVar29;
                  uVar29 = pCVar3->cover + pCVar3[1].cover + uVar29 + iVar135;
                  auVar128._0_4_ = iVar27 - auVar89._0_4_;
                  auVar128._4_4_ = iVar136 - auVar89._4_4_;
                  auVar128._8_4_ = (iVar137 + iVar22) - auVar89._8_4_;
                  auVar128._12_4_ = uVar29 - auVar89._12_4_;
                  auVar90 = pabsd(auVar89,auVar128);
                  auVar90 = packssdw(auVar90,auVar90);
                  sVar76 = auVar90._0_2_;
                  sVar78 = auVar90._2_2_;
                  sVar100 = auVar90._4_2_;
                  uVar98 = (ushort)(sVar51 < sVar100) * sVar51 |
                           (ushort)(sVar51 >= sVar100) * sVar100;
                  sVar100 = auVar90._6_2_;
                  uVar99 = (ushort)(sVar68 < sVar100) * sVar68 |
                           (ushort)(sVar68 >= sVar100) * sVar100;
                  auVar92._0_8_ =
                       CONCAT26(uVar99,CONCAT24(uVar98,CONCAT22((ushort)(sVar79 < sVar78) * sVar79 |
                                                                (ushort)(sVar79 >= sVar78) * sVar78,
                                                                (ushort)(sVar77 < sVar76) * sVar77 |
                                                                (ushort)(sVar77 >= sVar76) * sVar76)
                                               ));
                  sVar76 = auVar90._8_2_;
                  auVar88._0_10_ =
                       CONCAT28((ushort)(sVar70 < sVar76) * sVar70 |
                                (ushort)(sVar70 >= sVar76) * sVar76,auVar92._0_8_);
                  sVar76 = auVar90._10_2_;
                  auVar88._10_2_ =
                       (ushort)(sVar71 < sVar76) * sVar71 | (ushort)(sVar71 >= sVar76) * sVar76;
                  sVar76 = auVar90._12_2_;
                  sVar78 = auVar90._14_2_;
                  auVar91._12_2_ =
                       (ushort)(sVar72 < sVar76) * sVar72 | (ushort)(sVar72 >= sVar76) * sVar76;
                  auVar91._0_12_ = auVar88;
                  auVar91._14_2_ =
                       (ushort)(sVar74 < sVar78) * sVar74 | (ushort)(sVar74 >= sVar78) * sVar78;
                  auVar102 = pshuflw(auVar15 << 0x40,auVar91,0x50);
                  auVar94._12_2_ = uVar99;
                  auVar94._0_12_ = auVar88;
                  auVar94._14_2_ = uVar99;
                  auVar93._12_4_ = auVar94._12_4_;
                  auVar93._10_2_ = uVar98;
                  auVar93._0_10_ = auVar88._0_10_;
                  auVar92._10_6_ = auVar93._10_6_;
                  auVar92._8_2_ = uVar98;
                  *(undefined1 (*) [16])(pCVar25 + uVar24) = (undefined1  [16])0x0;
                  *(undefined1 (*) [16])(pCVar25 + uVar24 + 2) = (undefined1  [16])0x0;
                  auVar90 = *(undefined1 (*) [16])(puVar32 + uVar24 * 4);
                  in_XMM13 = pmovzxbw(auVar128,auVar90);
                  auVar103._0_4_ = auVar102._0_4_;
                  auVar103._4_4_ = auVar103._0_4_;
                  auVar103._8_4_ = auVar102._4_4_;
                  auVar103._12_4_ = auVar102._4_4_;
                  auVar95._4_4_ = auVar92._8_4_;
                  auVar95._0_4_ = auVar92._8_4_;
                  auVar95._8_4_ = auVar93._12_4_;
                  auVar95._12_4_ = auVar93._12_4_;
                  auVar103 = auVar103 ^ auVar47;
                  auVar95 = auVar95 ^ auVar47;
                  auVar139._0_2_ =
                       auVar102._0_2_ * sVar37 + sVar101 + auVar103._0_2_ * in_XMM13._0_2_;
                  auVar139._2_2_ =
                       auVar102._2_2_ * sVar40 + sVar110 + auVar103._2_2_ * in_XMM13._2_2_;
                  auVar139._4_2_ =
                       auVar102._0_2_ * sVar41 + sVar112 + auVar103._4_2_ * in_XMM13._4_2_;
                  auVar139._6_2_ =
                       auVar102._2_2_ * sVar42 + sVar114 + auVar103._6_2_ * in_XMM13._6_2_;
                  auVar139._8_2_ =
                       auVar102._4_2_ * sVar43 + sVar116 + auVar103._8_2_ * in_XMM13._8_2_;
                  auVar139._10_2_ =
                       auVar102._6_2_ * sVar44 + sVar118 + auVar103._10_2_ * in_XMM13._10_2_;
                  auVar139._12_2_ =
                       auVar102._4_2_ * sVar45 + sVar120 + auVar103._12_2_ * in_XMM13._12_2_;
                  auVar139._14_2_ =
                       auVar102._6_2_ * sVar46 + sVar122 + auVar103._14_2_ * in_XMM13._14_2_;
                  auVar102 = pmulhuw(auVar139,auVar17);
                  auVar145._0_2_ = uVar98 * sVar37 + sVar101 + auVar95._0_2_ * (ushort)auVar90[8];
                  auVar145._2_2_ = uVar98 * sVar40 + sVar110 + auVar95._2_2_ * (ushort)auVar90[9];
                  auVar145._4_2_ = uVar98 * sVar41 + sVar112 + auVar95._4_2_ * (ushort)auVar90[10];
                  auVar145._6_2_ = uVar98 * sVar42 + sVar114 + auVar95._6_2_ * (ushort)auVar90[0xb];
                  auVar145._8_2_ = uVar99 * sVar43 + sVar116 + auVar95._8_2_ * (ushort)auVar90[0xc];
                  auVar145._10_2_ =
                       uVar99 * sVar44 + sVar118 + auVar95._10_2_ * (ushort)auVar90[0xd];
                  auVar145._12_2_ =
                       uVar99 * sVar45 + sVar120 + auVar95._12_2_ * (ushort)auVar90[0xe];
                  auVar145._14_2_ =
                       uVar99 * sVar46 + sVar122 + auVar95._14_2_ * (ushort)auVar90[0xf];
                  in_XMM15 = pmulhuw(auVar145,auVar17);
                  sVar76 = auVar102._0_2_;
                  sVar78 = auVar102._2_2_;
                  sVar100 = auVar102._4_2_;
                  sVar109 = auVar102._6_2_;
                  sVar111 = auVar102._8_2_;
                  sVar113 = auVar102._10_2_;
                  sVar115 = auVar102._12_2_;
                  sVar117 = auVar102._14_2_;
                  sVar119 = in_XMM15._0_2_;
                  sVar121 = in_XMM15._2_2_;
                  sVar8 = in_XMM15._4_2_;
                  sVar9 = in_XMM15._6_2_;
                  sVar10 = in_XMM15._8_2_;
                  sVar11 = in_XMM15._10_2_;
                  sVar12 = in_XMM15._12_2_;
                  sVar13 = in_XMM15._14_2_;
                  puVar2 = puVar32 + uVar24 * 4;
                  *puVar2 = (0 < sVar76) * (sVar76 < 0x100) * auVar102[0] - (0xff < sVar76);
                  puVar2[1] = (0 < sVar78) * (sVar78 < 0x100) * auVar102[2] - (0xff < sVar78);
                  puVar2[2] = (0 < sVar100) * (sVar100 < 0x100) * auVar102[4] - (0xff < sVar100);
                  puVar2[3] = (0 < sVar109) * (sVar109 < 0x100) * auVar102[6] - (0xff < sVar109);
                  puVar2[4] = (0 < sVar111) * (sVar111 < 0x100) * auVar102[8] - (0xff < sVar111);
                  puVar2[5] = (0 < sVar113) * (sVar113 < 0x100) * auVar102[10] - (0xff < sVar113);
                  puVar2[6] = (0 < sVar115) * (sVar115 < 0x100) * auVar102[0xc] - (0xff < sVar115);
                  puVar2[7] = (0 < sVar117) * (sVar117 < 0x100) * auVar102[0xe] - (0xff < sVar117);
                  puVar2[8] = (0 < sVar119) * (sVar119 < 0x100) * in_XMM15[0] - (0xff < sVar119);
                  puVar2[9] = (0 < sVar121) * (sVar121 < 0x100) * in_XMM15[2] - (0xff < sVar121);
                  puVar2[10] = (0 < sVar8) * (sVar8 < 0x100) * in_XMM15[4] - (0xff < sVar8);
                  puVar2[0xb] = (0 < sVar9) * (sVar9 < 0x100) * in_XMM15[6] - (0xff < sVar9);
                  puVar2[0xc] = (0 < sVar10) * (sVar10 < 0x100) * in_XMM15[8] - (0xff < sVar10);
                  puVar2[0xd] = (0 < sVar11) * (sVar11 < 0x100) * in_XMM15[10] - (0xff < sVar11);
                  puVar2[0xe] = (0 < sVar12) * (sVar12 < 0x100) * in_XMM15[0xc] - (0xff < sVar12);
                  puVar2[0xf] = (0 < sVar13) * (sVar13 < 0x100) * in_XMM15[0xe] - (0xff < sVar13);
                  uVar24 = uVar24 + 4;
                  uVar26 = uVar26 - 1;
                  uVar35 = uVar29;
                } while (uVar26 != 0);
              }
              if (uVar24 < uVar19) {
                do {
                  uVar29 = uVar29 + pCVar25[uVar24].cover;
                  iVar22 = pCVar25[uVar24].area;
                  pCVar25[uVar24].cover = 0;
                  pCVar25[uVar24].area = 0;
                  uVar87 = iVar22 >> 9;
                  auVar104._0_4_ = uVar29 - uVar87;
                  auVar104._4_4_ = uVar35;
                  auVar104._8_4_ = uVar35;
                  auVar104._12_4_ = uVar35;
                  auVar90 = pabsd(ZEXT416(uVar87),auVar104);
                  auVar90 = packssdw(auVar90,auVar90);
                  auVar90 = pshuflw(auVar90,auVar90,0);
                  sVar76 = auVar90._0_2_;
                  auVar96._0_2_ =
                       (ushort)(sVar77 < sVar76) * sVar77 | (ushort)(sVar77 >= sVar76) * sVar76;
                  sVar76 = auVar90._2_2_;
                  auVar96._2_2_ =
                       (ushort)(sVar79 < sVar76) * sVar79 | (ushort)(sVar79 >= sVar76) * sVar76;
                  sVar76 = auVar90._4_2_;
                  auVar96._4_2_ =
                       (ushort)(sVar51 < sVar76) * sVar51 | (ushort)(sVar51 >= sVar76) * sVar76;
                  sVar76 = auVar90._6_2_;
                  auVar96._6_2_ =
                       (ushort)(sVar68 < sVar76) * sVar68 | (ushort)(sVar68 >= sVar76) * sVar76;
                  sVar76 = auVar90._8_2_;
                  auVar96._8_2_ =
                       (ushort)(sVar70 < sVar76) * sVar70 | (ushort)(sVar70 >= sVar76) * sVar76;
                  sVar76 = auVar90._10_2_;
                  auVar96._10_2_ =
                       (ushort)(sVar71 < sVar76) * sVar71 | (ushort)(sVar71 >= sVar76) * sVar76;
                  sVar76 = auVar90._12_2_;
                  sVar78 = auVar90._14_2_;
                  auVar96._12_2_ =
                       (ushort)(sVar72 < sVar76) * sVar72 | (ushort)(sVar72 >= sVar76) * sVar76;
                  auVar96._14_2_ =
                       (ushort)(sVar74 < sVar78) * sVar74 | (ushort)(sVar74 >= sVar78) * sVar78;
                  auVar102 = pmovzxbw(ZEXT416(*(uint *)(puVar32 + uVar24 * 4)),
                                      ZEXT416(*(uint *)(puVar32 + uVar24 * 4)));
                  auVar90 = auVar96 ^ auVar80;
                  auVar97._0_2_ = auVar90._0_2_ * auVar102._0_2_ + auVar96._0_2_ * sVar37 + sVar123;
                  auVar97._2_2_ = auVar90._2_2_ * auVar102._2_2_ + auVar96._2_2_ * sVar40 + sVar50;
                  auVar97._4_2_ = auVar90._4_2_ * auVar102._4_2_ + auVar96._4_2_ * sVar41 + sVar52;
                  auVar97._6_2_ = auVar90._6_2_ * auVar102._6_2_ + auVar96._6_2_ * sVar42 + sVar49;
                  auVar97._8_2_ = auVar90._8_2_ * auVar102._8_2_ + auVar96._8_2_ * sVar43 + sVar67;
                  auVar97._10_2_ =
                       auVar90._10_2_ * auVar102._10_2_ + auVar96._10_2_ * sVar44 + sVar69;
                  auVar97._12_2_ =
                       auVar90._12_2_ * auVar102._12_2_ + auVar96._12_2_ * sVar45 + sVar73;
                  auVar97._14_2_ =
                       auVar90._14_2_ * auVar102._14_2_ + auVar96._14_2_ * sVar46 + sVar75;
                  auVar90 = pmulhuw(auVar97,auVar18);
                  sVar76 = auVar90._0_2_;
                  sVar78 = auVar90._2_2_;
                  sVar100 = auVar90._4_2_;
                  sVar109 = auVar90._6_2_;
                  *(uint *)(puVar32 + uVar24 * 4) =
                       CONCAT13((0 < sVar109) * (sVar109 < 0x100) * auVar90[6] - (0xff < sVar109),
                                CONCAT12((0 < sVar100) * (sVar100 < 0x100) * auVar90[4] -
                                         (0xff < sVar100),
                                         CONCAT11((0 < sVar78) * (sVar78 < 0x100) * auVar90[2] -
                                                  (0xff < sVar78),
                                                  (0 < sVar76) * (sVar76 < 0x100) * auVar90[0] -
                                                  (0xff < sVar76))));
                  uVar24 = uVar24 + 1;
                } while (uVar19 != uVar24);
              }
              BVar30 = uVar23;
            } while (uVar23 != 0);
          }
          uVar33 = uVar33 + 0x800;
          pBVar36 = pBVar36 + 1;
          sVar21 = sVar21 - 1;
        } while (sVar21 != 0);
        uVar33 = (ulong)(self->super_CellRasterizer).super_Rasterizer._width;
        uVar24 = uVar33 - uVar19;
        if (uVar19 <= uVar33 && uVar24 != 0) {
          uVar35 = -uVar29;
          if (0 < (int)uVar29) {
            uVar35 = uVar29;
          }
          uVar87 = 0xff;
          if ((int)uVar35 < 0xff) {
            uVar87 = uVar35;
          }
          if (uVar29 != 0) {
            uVar23 = uVar24 >> 2;
            if (uVar35 < 0xff) {
              auVar90 = pshuflw(ZEXT416(uVar87),ZEXT416(uVar87),0);
              auVar82._0_4_ = auVar90._0_4_;
              auVar82._4_4_ = auVar82._0_4_;
              auVar82._8_4_ = auVar82._0_4_;
              auVar82._12_4_ = auVar82._0_4_;
              sVar76 = auVar90._0_2_;
              sVar78 = auVar90._2_2_;
              auVar82 = auVar82 ^ auVar47;
              sVar101 = sVar76 * sVar37 + sVar101;
              sVar110 = sVar78 * sVar40 + sVar110;
              sVar112 = sVar76 * sVar41 + sVar112;
              sVar114 = sVar78 * sVar42 + sVar114;
              sVar116 = sVar76 * sVar43 + sVar116;
              sVar118 = sVar78 * sVar44 + sVar118;
              sVar120 = sVar76 * sVar45 + sVar120;
              sVar122 = sVar78 * sVar46 + sVar122;
              sVar77 = auVar82._0_2_;
              sVar79 = auVar82._2_2_;
              sVar51 = auVar82._4_2_;
              sVar68 = auVar82._6_2_;
              sVar70 = auVar82._8_2_;
              sVar71 = auVar82._10_2_;
              sVar72 = auVar82._12_2_;
              sVar74 = auVar82._14_2_;
              if (7 < uVar24) {
                do {
                  auVar90 = *(undefined1 (*) [16])(puVar32 + uVar19 * 4);
                  auVar102 = *(undefined1 (*) [16])(puVar32 + uVar19 * 4 + 0x10);
                  auVar131 = pmovzxbw(in_XMM13,auVar90);
                  auVar147 = pmovzxbw(in_XMM15,auVar102);
                  auVar141._0_2_ = (ushort)auVar90[8] * sVar77 + sVar101;
                  auVar141._2_2_ = (ushort)auVar90[9] * sVar79 + sVar110;
                  auVar141._4_2_ = (ushort)auVar90[10] * sVar51 + sVar112;
                  auVar141._6_2_ = (ushort)auVar90[0xb] * sVar68 + sVar114;
                  auVar141._8_2_ = (ushort)auVar90[0xc] * sVar70 + sVar116;
                  auVar141._10_2_ = (ushort)auVar90[0xd] * sVar71 + sVar118;
                  auVar141._12_2_ = (ushort)auVar90[0xe] * sVar72 + sVar120;
                  auVar141._14_2_ = (ushort)auVar90[0xf] * sVar74 + sVar122;
                  auVar142 = pmulhuw(auVar141,auVar17);
                  auVar126._0_2_ = (ushort)auVar102[8] * sVar77 + sVar101;
                  auVar126._2_2_ = (ushort)auVar102[9] * sVar79 + sVar110;
                  auVar126._4_2_ = (ushort)auVar102[10] * sVar51 + sVar112;
                  auVar126._6_2_ = (ushort)auVar102[0xb] * sVar68 + sVar114;
                  auVar126._8_2_ = (ushort)auVar102[0xc] * sVar70 + sVar116;
                  auVar126._10_2_ = (ushort)auVar102[0xd] * sVar71 + sVar118;
                  auVar126._12_2_ = (ushort)auVar102[0xe] * sVar72 + sVar120;
                  auVar126._14_2_ = (ushort)auVar102[0xf] * sVar74 + sVar122;
                  auVar90 = pmulhuw(auVar126,auVar17);
                  auVar132._0_2_ = auVar131._0_2_ * sVar77 + sVar101;
                  auVar132._2_2_ = auVar131._2_2_ * sVar79 + sVar110;
                  auVar132._4_2_ = auVar131._4_2_ * sVar51 + sVar112;
                  auVar132._6_2_ = auVar131._6_2_ * sVar68 + sVar114;
                  auVar132._8_2_ = auVar131._8_2_ * sVar70 + sVar116;
                  auVar132._10_2_ = auVar131._10_2_ * sVar71 + sVar118;
                  auVar132._12_2_ = auVar131._12_2_ * sVar72 + sVar120;
                  auVar132._14_2_ = auVar131._14_2_ * sVar74 + sVar122;
                  auVar102 = pmulhuw(auVar132,auVar17);
                  sVar100 = auVar102._0_2_;
                  sVar109 = auVar102._2_2_;
                  in_XMM13[1] = (0 < sVar109) * (sVar109 < 0x100) * auVar102[2] - (0xff < sVar109);
                  in_XMM13[0] = (0 < sVar100) * (sVar100 < 0x100) * auVar102[0] - (0xff < sVar100);
                  sVar100 = auVar102._4_2_;
                  in_XMM13[2] = (0 < sVar100) * (sVar100 < 0x100) * auVar102[4] - (0xff < sVar100);
                  sVar100 = auVar102._6_2_;
                  in_XMM13[3] = (0 < sVar100) * (sVar100 < 0x100) * auVar102[6] - (0xff < sVar100);
                  sVar100 = auVar102._8_2_;
                  in_XMM13[4] = (0 < sVar100) * (sVar100 < 0x100) * auVar102[8] - (0xff < sVar100);
                  sVar100 = auVar102._10_2_;
                  in_XMM13[5] = (0 < sVar100) * (sVar100 < 0x100) * auVar102[10] - (0xff < sVar100);
                  sVar100 = auVar102._12_2_;
                  in_XMM13[6] = (0 < sVar100) * (sVar100 < 0x100) * auVar102[0xc] - (0xff < sVar100)
                  ;
                  sVar100 = auVar102._14_2_;
                  in_XMM13[7] = (0 < sVar100) * (sVar100 < 0x100) * auVar102[0xe] - (0xff < sVar100)
                  ;
                  sVar100 = auVar142._0_2_;
                  in_XMM13[8] = (0 < sVar100) * (sVar100 < 0x100) * auVar142[0] - (0xff < sVar100);
                  sVar100 = auVar142._2_2_;
                  in_XMM13[9] = (0 < sVar100) * (sVar100 < 0x100) * auVar142[2] - (0xff < sVar100);
                  sVar100 = auVar142._4_2_;
                  in_XMM13[10] = (0 < sVar100) * (sVar100 < 0x100) * auVar142[4] - (0xff < sVar100);
                  sVar100 = auVar142._6_2_;
                  in_XMM13[0xb] = (0 < sVar100) * (sVar100 < 0x100) * auVar142[6] - (0xff < sVar100)
                  ;
                  sVar100 = auVar142._8_2_;
                  in_XMM13[0xc] = (0 < sVar100) * (sVar100 < 0x100) * auVar142[8] - (0xff < sVar100)
                  ;
                  sVar100 = auVar142._10_2_;
                  in_XMM13[0xd] =
                       (0 < sVar100) * (sVar100 < 0x100) * auVar142[10] - (0xff < sVar100);
                  sVar100 = auVar142._12_2_;
                  in_XMM13[0xe] =
                       (0 < sVar100) * (sVar100 < 0x100) * auVar142[0xc] - (0xff < sVar100);
                  sVar100 = auVar142._14_2_;
                  in_XMM13[0xf] =
                       (0 < sVar100) * (sVar100 < 0x100) * auVar142[0xe] - (0xff < sVar100);
                  auVar148._0_2_ = auVar147._0_2_ * sVar77 + sVar101;
                  auVar148._2_2_ = auVar147._2_2_ * sVar79 + sVar110;
                  auVar148._4_2_ = auVar147._4_2_ * sVar51 + sVar112;
                  auVar148._6_2_ = auVar147._6_2_ * sVar68 + sVar114;
                  auVar148._8_2_ = auVar147._8_2_ * sVar70 + sVar116;
                  auVar148._10_2_ = auVar147._10_2_ * sVar71 + sVar118;
                  auVar148._12_2_ = auVar147._12_2_ * sVar72 + sVar120;
                  auVar148._14_2_ = auVar147._14_2_ * sVar74 + sVar122;
                  auVar102 = pmulhuw(auVar148,auVar17);
                  sVar100 = auVar102._0_2_;
                  sVar109 = auVar102._2_2_;
                  in_XMM15[1] = (0 < sVar109) * (sVar109 < 0x100) * auVar102[2] - (0xff < sVar109);
                  in_XMM15[0] = (0 < sVar100) * (sVar100 < 0x100) * auVar102[0] - (0xff < sVar100);
                  sVar100 = auVar102._4_2_;
                  in_XMM15[2] = (0 < sVar100) * (sVar100 < 0x100) * auVar102[4] - (0xff < sVar100);
                  sVar100 = auVar102._6_2_;
                  in_XMM15[3] = (0 < sVar100) * (sVar100 < 0x100) * auVar102[6] - (0xff < sVar100);
                  sVar100 = auVar102._8_2_;
                  in_XMM15[4] = (0 < sVar100) * (sVar100 < 0x100) * auVar102[8] - (0xff < sVar100);
                  sVar100 = auVar102._10_2_;
                  in_XMM15[5] = (0 < sVar100) * (sVar100 < 0x100) * auVar102[10] - (0xff < sVar100);
                  sVar100 = auVar102._12_2_;
                  in_XMM15[6] = (0 < sVar100) * (sVar100 < 0x100) * auVar102[0xc] - (0xff < sVar100)
                  ;
                  sVar100 = auVar102._14_2_;
                  in_XMM15[7] = (0 < sVar100) * (sVar100 < 0x100) * auVar102[0xe] - (0xff < sVar100)
                  ;
                  sVar100 = auVar90._0_2_;
                  in_XMM15[8] = (0 < sVar100) * (sVar100 < 0x100) * auVar90[0] - (0xff < sVar100);
                  sVar100 = auVar90._2_2_;
                  in_XMM15[9] = (0 < sVar100) * (sVar100 < 0x100) * auVar90[2] - (0xff < sVar100);
                  sVar100 = auVar90._4_2_;
                  in_XMM15[10] = (0 < sVar100) * (sVar100 < 0x100) * auVar90[4] - (0xff < sVar100);
                  sVar100 = auVar90._6_2_;
                  in_XMM15[0xb] = (0 < sVar100) * (sVar100 < 0x100) * auVar90[6] - (0xff < sVar100);
                  sVar100 = auVar90._8_2_;
                  in_XMM15[0xc] = (0 < sVar100) * (sVar100 < 0x100) * auVar90[8] - (0xff < sVar100);
                  sVar100 = auVar90._10_2_;
                  in_XMM15[0xd] = (0 < sVar100) * (sVar100 < 0x100) * auVar90[10] - (0xff < sVar100)
                  ;
                  sVar100 = auVar90._12_2_;
                  in_XMM15[0xe] =
                       (0 < sVar100) * (sVar100 < 0x100) * auVar90[0xc] - (0xff < sVar100);
                  sVar100 = auVar90._14_2_;
                  in_XMM15[0xf] =
                       (0 < sVar100) * (sVar100 < 0x100) * auVar90[0xe] - (0xff < sVar100);
                  *(undefined1 (*) [16])(puVar32 + uVar19 * 4) = in_XMM13;
                  *(undefined1 (*) [16])(puVar32 + uVar19 * 4 + 0x10) = in_XMM15;
                  uVar19 = uVar19 + 8;
                  uVar23 = uVar23 - 2;
                } while (1 < uVar23);
              }
              if (uVar23 != 0) {
                auVar90 = *(undefined1 (*) [16])(puVar32 + uVar19 * 4);
                auVar102 = pmovzxbw(in_XMM13,auVar90);
                auVar127._0_2_ = (ushort)auVar90[8] * sVar77 + sVar101;
                auVar127._2_2_ = (ushort)auVar90[9] * sVar79 + sVar110;
                auVar127._4_2_ = (ushort)auVar90[10] * sVar51 + sVar112;
                auVar127._6_2_ = (ushort)auVar90[0xb] * sVar68 + sVar114;
                auVar127._8_2_ = (ushort)auVar90[0xc] * sVar70 + sVar116;
                auVar127._10_2_ = (ushort)auVar90[0xd] * sVar71 + sVar118;
                auVar127._12_2_ = (ushort)auVar90[0xe] * sVar72 + sVar120;
                auVar127._14_2_ = (ushort)auVar90[0xf] * sVar74 + sVar122;
                auVar90 = pmulhuw(auVar127,auVar17);
                auVar133._0_2_ = auVar102._0_2_ * sVar77 + sVar101;
                auVar133._2_2_ = auVar102._2_2_ * sVar79 + sVar110;
                auVar133._4_2_ = auVar102._4_2_ * sVar51 + sVar112;
                auVar133._6_2_ = auVar102._6_2_ * sVar68 + sVar114;
                auVar133._8_2_ = auVar102._8_2_ * sVar70 + sVar116;
                auVar133._10_2_ = auVar102._10_2_ * sVar71 + sVar118;
                auVar133._12_2_ = auVar102._12_2_ * sVar72 + sVar120;
                auVar133._14_2_ = auVar102._14_2_ * sVar74 + sVar122;
                auVar102 = pmulhuw(auVar133,auVar17);
                sVar101 = auVar102._0_2_;
                sVar110 = auVar102._2_2_;
                in_XMM13[1] = (0 < sVar110) * (sVar110 < 0x100) * auVar102[2] - (0xff < sVar110);
                in_XMM13[0] = (0 < sVar101) * (sVar101 < 0x100) * auVar102[0] - (0xff < sVar101);
                sVar101 = auVar102._4_2_;
                in_XMM13[2] = (0 < sVar101) * (sVar101 < 0x100) * auVar102[4] - (0xff < sVar101);
                sVar101 = auVar102._6_2_;
                in_XMM13[3] = (0 < sVar101) * (sVar101 < 0x100) * auVar102[6] - (0xff < sVar101);
                sVar101 = auVar102._8_2_;
                in_XMM13[4] = (0 < sVar101) * (sVar101 < 0x100) * auVar102[8] - (0xff < sVar101);
                sVar101 = auVar102._10_2_;
                in_XMM13[5] = (0 < sVar101) * (sVar101 < 0x100) * auVar102[10] - (0xff < sVar101);
                sVar101 = auVar102._12_2_;
                in_XMM13[6] = (0 < sVar101) * (sVar101 < 0x100) * auVar102[0xc] - (0xff < sVar101);
                sVar101 = auVar102._14_2_;
                in_XMM13[7] = (0 < sVar101) * (sVar101 < 0x100) * auVar102[0xe] - (0xff < sVar101);
                sVar101 = auVar90._0_2_;
                in_XMM13[8] = (0 < sVar101) * (sVar101 < 0x100) * auVar90[0] - (0xff < sVar101);
                sVar101 = auVar90._2_2_;
                in_XMM13[9] = (0 < sVar101) * (sVar101 < 0x100) * auVar90[2] - (0xff < sVar101);
                sVar101 = auVar90._4_2_;
                in_XMM13[10] = (0 < sVar101) * (sVar101 < 0x100) * auVar90[4] - (0xff < sVar101);
                sVar101 = auVar90._6_2_;
                in_XMM13[0xb] = (0 < sVar101) * (sVar101 < 0x100) * auVar90[6] - (0xff < sVar101);
                sVar101 = auVar90._8_2_;
                in_XMM13[0xc] = (0 < sVar101) * (sVar101 < 0x100) * auVar90[8] - (0xff < sVar101);
                sVar101 = auVar90._10_2_;
                in_XMM13[0xd] = (0 < sVar101) * (sVar101 < 0x100) * auVar90[10] - (0xff < sVar101);
                sVar101 = auVar90._12_2_;
                in_XMM13[0xe] = (0 < sVar101) * (sVar101 < 0x100) * auVar90[0xc] - (0xff < sVar101);
                sVar101 = auVar90._14_2_;
                in_XMM13[0xf] = (0 < sVar101) * (sVar101 < 0x100) * auVar90[0xe] - (0xff < sVar101);
                *(undefined1 (*) [16])(puVar32 + uVar19 * 4) = in_XMM13;
                uVar19 = uVar19 + 4;
              }
              if (uVar19 < uVar33) {
                do {
                  auVar90 = pmovzxbw(ZEXT416(*(uint *)(puVar32 + uVar19 * 4)),
                                     ZEXT416(*(uint *)(puVar32 + uVar19 * 4)));
                  auVar106._0_2_ = auVar90._0_2_ * sVar77 + sVar76 * sVar37 + sVar123;
                  auVar106._2_2_ = auVar90._2_2_ * sVar79 + sVar78 * sVar40 + sVar50;
                  auVar106._4_2_ = auVar90._4_2_ * sVar51 + sVar76 * sVar41 + sVar52;
                  auVar106._6_2_ = auVar90._6_2_ * sVar68 + sVar78 * sVar42 + sVar49;
                  auVar106._8_2_ = auVar90._8_2_ * sVar70 + sVar76 * sVar43 + sVar67;
                  auVar106._10_2_ = auVar90._10_2_ * sVar71 + sVar78 * sVar44 + sVar69;
                  auVar106._12_2_ = auVar90._12_2_ * sVar72 + sVar76 * sVar45 + sVar73;
                  auVar106._14_2_ = auVar90._14_2_ * sVar74 + sVar78 * sVar46 + sVar75;
                  auVar90 = pmulhuw(auVar106,auVar18);
                  sVar101 = auVar90._0_2_;
                  sVar110 = auVar90._2_2_;
                  sVar112 = auVar90._4_2_;
                  sVar114 = auVar90._6_2_;
                  *(uint *)(puVar32 + uVar19 * 4) =
                       CONCAT13((0 < sVar114) * (sVar114 < 0x100) * auVar90[6] - (0xff < sVar114),
                                CONCAT12((0 < sVar112) * (sVar112 < 0x100) * auVar90[4] -
                                         (0xff < sVar112),
                                         CONCAT11((0 < sVar110) * (sVar110 < 0x100) * auVar90[2] -
                                                  (0xff < sVar110),
                                                  (0 < sVar101) * (sVar101 < 0x100) * auVar90[0] -
                                                  (0xff < sVar101))));
                  uVar19 = uVar19 + 1;
                } while (uVar33 != uVar19);
              }
            }
            else {
              if (0x1f < uVar24) {
                do {
                  *(undefined1 (*) [16])(puVar32 + uVar19 * 4) = auVar39;
                  *(undefined1 (*) [16])(puVar32 + uVar19 * 4 + 0x10) = auVar39;
                  *(undefined1 (*) [16])(puVar32 + uVar19 * 4 + 0x20) = auVar39;
                  *(undefined1 (*) [16])(puVar32 + uVar19 * 4 + 0x30) = auVar39;
                  *(undefined1 (*) [16])(puVar32 + uVar19 * 4 + 0x40) = auVar39;
                  *(undefined1 (*) [16])(puVar32 + uVar19 * 4 + 0x50) = auVar39;
                  *(undefined1 (*) [16])(puVar32 + uVar19 * 4 + 0x60) = auVar39;
                  *(undefined1 (*) [16])(puVar32 + uVar19 * 4 + 0x70) = auVar39;
                  uVar19 = uVar19 + 0x20;
                  uVar23 = uVar23 - 8;
                } while (7 < uVar23);
              }
              for (; uVar23 != 0; uVar23 = uVar23 - 1) {
                *(undefined1 (*) [16])(puVar32 + uVar19 * 4) = auVar39;
                uVar19 = uVar19 + 4;
              }
              if (uVar19 < uVar33) {
                do {
                  *(uint *)(puVar32 + uVar19 * 4) = uVar31;
                  uVar19 = uVar19 + 1;
                } while (uVar33 != uVar19);
              }
            }
          }
        }
        puVar32 = puVar32 + lVar6;
        pCVar25 = pCVar25 + self->_cellStride;
        uVar34 = uVar34 + 1;
      } while (uVar34 <= (ulong)(long)(int)uVar4);
    }
    (self->_yBounds).start = 0x7fffffff;
    (self->_yBounds).end = 0;
    return;
  }
  RasterizerA3<32u>::_renderImpl<CompositorScalar,true>((RasterizerA3<32u> *)self,argb32);
  return;
}

Assistant:

inline bool hasOption(uint32_t option) const noexcept { return (_options & option) != 0; }